

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::CatmullRomCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive *pPVar2;
  Primitive PVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined3 uVar20;
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined6 uVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  byte bVar41;
  ulong uVar42;
  RTCFilterFunctionN p_Var43;
  ulong uVar44;
  byte bVar45;
  ulong uVar46;
  bool bVar47;
  uint uVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  short sVar54;
  float fVar55;
  float fVar95;
  float fVar96;
  vfloat_impl<4> p00;
  undefined2 uVar94;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  float fVar97;
  undefined8 uVar98;
  float fVar116;
  float fVar117;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar115 [16];
  float fVar118;
  float fVar130;
  float fVar131;
  vfloat4 v;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  float fVar137;
  float fVar138;
  vfloat4 v_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar152;
  float fVar153;
  vfloat4 a;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar181;
  float fVar182;
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  float fVar189;
  float fVar190;
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar200;
  float fVar201;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar214;
  float fVar215;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar216;
  float fVar224;
  float fVar225;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar227;
  float fVar233;
  float fVar235;
  vfloat4 a_1;
  float fVar234;
  float fVar236;
  float fVar237;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar238;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar249;
  float fVar256;
  undefined8 uVar250;
  float fVar255;
  float fVar257;
  float fVar259;
  undefined1 auVar251 [16];
  float fVar258;
  float fVar260;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar261;
  float fVar265;
  float fVar266;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined4 local_3d4;
  ulong local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  ulong local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 uVar93;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  
  PVar3 = prim[1];
  uVar44 = (ulong)(byte)PVar3;
  pPVar2 = prim + uVar44 * 0x19 + 6;
  fVar131 = *(float *)(pPVar2 + 0xc);
  fVar132 = ((ray->org).field_0.m128[0] - *(float *)pPVar2) * fVar131;
  fVar137 = ((ray->org).field_0.m128[1] - *(float *)(pPVar2 + 4)) * fVar131;
  fVar138 = ((ray->org).field_0.m128[2] - *(float *)(pPVar2 + 8)) * fVar131;
  fVar118 = fVar131 * (ray->dir).field_0.m128[0];
  fVar130 = fVar131 * (ray->dir).field_0.m128[1];
  fVar131 = fVar131 * (ray->dir).field_0.m128[2];
  uVar4 = *(undefined4 *)(prim + uVar44 * 4 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar42;
  auVar104._12_2_ = uVar94;
  auVar104._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar205._12_4_ = auVar104._12_4_;
  auVar205._8_2_ = 0;
  auVar205._0_8_ = uVar42;
  auVar205._10_2_ = uVar94;
  auVar63._10_6_ = auVar205._10_6_;
  auVar63._8_2_ = uVar94;
  auVar63._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar24._4_8_ = auVar63._8_8_;
  auVar24._2_2_ = uVar94;
  auVar24._0_2_ = uVar94;
  fVar97 = (float)((int)sVar54 >> 8);
  fVar116 = (float)(auVar24._0_4_ >> 0x18);
  fVar117 = (float)(auVar63._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 5 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar56._8_4_ = 0;
  auVar56._0_8_ = uVar42;
  auVar56._12_2_ = uVar94;
  auVar56._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar218._12_4_ = auVar56._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar42;
  auVar218._10_2_ = uVar94;
  auVar122._10_6_ = auVar218._10_6_;
  auVar122._8_2_ = uVar94;
  auVar122._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar25._4_8_ = auVar122._8_8_;
  auVar25._2_2_ = uVar94;
  auVar25._0_2_ = uVar94;
  fVar139 = (float)((int)sVar54 >> 8);
  fVar152 = (float)(auVar25._0_4_ >> 0x18);
  fVar153 = (float)(auVar122._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 6 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar42;
  auVar59._12_2_ = uVar94;
  auVar59._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar58._12_4_ = auVar59._12_4_;
  auVar58._8_2_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._10_2_ = uVar94;
  auVar57._10_6_ = auVar58._10_6_;
  auVar57._8_2_ = uVar94;
  auVar57._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar26._4_8_ = auVar57._8_8_;
  auVar26._2_2_ = uVar94;
  auVar26._0_2_ = uVar94;
  fVar191 = (float)((int)sVar54 >> 8);
  fVar200 = (float)(auVar26._0_4_ >> 0x18);
  fVar201 = (float)(auVar57._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0xb + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar42;
  auVar62._12_2_ = uVar94;
  auVar62._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._10_2_ = uVar94;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar94;
  auVar60._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar27._4_8_ = auVar60._8_8_;
  auVar27._2_2_ = uVar94;
  auVar27._0_2_ = uVar94;
  fVar55 = (float)((int)sVar54 >> 8);
  fVar95 = (float)(auVar27._0_4_ >> 0x18);
  fVar96 = (float)(auVar60._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0xc + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar157._8_4_ = 0;
  auVar157._0_8_ = uVar42;
  auVar157._12_2_ = uVar94;
  auVar157._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar42;
  auVar156._10_2_ = uVar94;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._8_2_ = uVar94;
  auVar155._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar28._4_8_ = auVar155._8_8_;
  auVar28._2_2_ = uVar94;
  auVar28._0_2_ = uVar94;
  fVar183 = (float)((int)sVar54 >> 8);
  fVar189 = (float)(auVar28._0_4_ >> 0x18);
  fVar190 = (float)(auVar155._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0xd + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar42;
  auVar160._12_2_ = uVar94;
  auVar160._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar42;
  auVar159._10_2_ = uVar94;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar94;
  auVar158._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar29._4_8_ = auVar158._8_8_;
  auVar29._2_2_ = uVar94;
  auVar29._0_2_ = uVar94;
  fVar216 = (float)((int)sVar54 >> 8);
  fVar224 = (float)(auVar29._0_4_ >> 0x18);
  fVar225 = (float)(auVar158._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0x12 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar163._8_4_ = 0;
  auVar163._0_8_ = uVar42;
  auVar163._12_2_ = uVar94;
  auVar163._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._8_2_ = 0;
  auVar162._0_8_ = uVar42;
  auVar162._10_2_ = uVar94;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = uVar94;
  auVar161._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar30._4_8_ = auVar161._8_8_;
  auVar30._2_2_ = uVar94;
  auVar30._0_2_ = uVar94;
  fVar202 = (float)((int)sVar54 >> 8);
  fVar214 = (float)(auVar30._0_4_ >> 0x18);
  fVar215 = (float)(auVar161._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0x13 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar166._8_4_ = 0;
  auVar166._0_8_ = uVar42;
  auVar166._12_2_ = uVar94;
  auVar166._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._8_2_ = 0;
  auVar165._0_8_ = uVar42;
  auVar165._10_2_ = uVar94;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._8_2_ = uVar94;
  auVar164._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar31._4_8_ = auVar164._8_8_;
  auVar31._2_2_ = uVar94;
  auVar31._0_2_ = uVar94;
  fVar226 = (float)((int)sVar54 >> 8);
  fVar233 = (float)(auVar31._0_4_ >> 0x18);
  fVar235 = (float)(auVar164._8_4_ >> 0x18);
  uVar4 = *(undefined4 *)(prim + uVar44 * 0x14 + 6);
  uVar93 = (undefined1)((uint)uVar4 >> 0x18);
  uVar94 = CONCAT11(uVar93,uVar93);
  uVar93 = (undefined1)((uint)uVar4 >> 0x10);
  uVar98 = CONCAT35(CONCAT21(uVar94,uVar93),CONCAT14(uVar93,uVar4));
  uVar93 = (undefined1)((uint)uVar4 >> 8);
  uVar23 = CONCAT51(CONCAT41((int)((ulong)uVar98 >> 0x20),uVar93),uVar93);
  sVar54 = CONCAT11((char)uVar4,(char)uVar4);
  uVar42 = CONCAT62(uVar23,sVar54);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar42;
  auVar169._12_2_ = uVar94;
  auVar169._14_2_ = uVar94;
  uVar94 = (undefined2)((ulong)uVar98 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar42;
  auVar168._10_2_ = uVar94;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar94;
  auVar167._0_8_ = uVar42;
  uVar94 = (undefined2)uVar23;
  auVar32._4_8_ = auVar167._8_8_;
  auVar32._2_2_ = uVar94;
  auVar32._0_2_ = uVar94;
  fVar261 = (float)((int)sVar54 >> 8);
  fVar265 = (float)(auVar32._0_4_ >> 0x18);
  fVar266 = (float)(auVar167._8_4_ >> 0x18);
  fVar248 = fVar118 * fVar97 + fVar130 * fVar139 + fVar131 * fVar191;
  fVar255 = fVar118 * fVar116 + fVar130 * fVar152 + fVar131 * fVar200;
  fVar257 = fVar118 * fVar117 + fVar130 * fVar153 + fVar131 * fVar201;
  fVar259 = fVar118 * (float)(auVar205._12_4_ >> 0x18) +
            fVar130 * (float)(auVar218._12_4_ >> 0x18) + fVar131 * (float)(auVar58._12_4_ >> 0x18);
  fVar238 = fVar118 * fVar55 + fVar130 * fVar183 + fVar131 * fVar216;
  fVar245 = fVar118 * fVar95 + fVar130 * fVar189 + fVar131 * fVar224;
  fVar246 = fVar118 * fVar96 + fVar130 * fVar190 + fVar131 * fVar225;
  fVar247 = fVar118 * (float)(auVar61._12_4_ >> 0x18) +
            fVar130 * (float)(auVar156._12_4_ >> 0x18) + fVar131 * (float)(auVar159._12_4_ >> 0x18);
  fVar154 = fVar118 * fVar202 + fVar130 * fVar226 + fVar131 * fVar261;
  fVar181 = fVar118 * fVar214 + fVar130 * fVar233 + fVar131 * fVar265;
  fVar182 = fVar118 * fVar215 + fVar130 * fVar235 + fVar131 * fVar266;
  fVar118 = fVar118 * (float)(auVar162._12_4_ >> 0x18) +
            fVar130 * (float)(auVar165._12_4_ >> 0x18) + fVar131 * (float)(auVar168._12_4_ >> 0x18);
  fVar139 = fVar97 * fVar132 + fVar139 * fVar137 + fVar191 * fVar138;
  fVar152 = fVar116 * fVar132 + fVar152 * fVar137 + fVar200 * fVar138;
  fVar153 = fVar117 * fVar132 + fVar153 * fVar137 + fVar201 * fVar138;
  fVar191 = (float)(auVar205._12_4_ >> 0x18) * fVar132 +
            (float)(auVar218._12_4_ >> 0x18) * fVar137 + (float)(auVar58._12_4_ >> 0x18) * fVar138;
  fVar201 = fVar55 * fVar132 + fVar183 * fVar137 + fVar216 * fVar138;
  fVar216 = fVar95 * fVar132 + fVar189 * fVar137 + fVar224 * fVar138;
  fVar224 = fVar96 * fVar132 + fVar190 * fVar137 + fVar225 * fVar138;
  fVar225 = (float)(auVar61._12_4_ >> 0x18) * fVar132 +
            (float)(auVar156._12_4_ >> 0x18) * fVar137 + (float)(auVar159._12_4_ >> 0x18) * fVar138;
  fVar183 = fVar132 * fVar202 + fVar137 * fVar226 + fVar138 * fVar261;
  fVar189 = fVar132 * fVar214 + fVar137 * fVar233 + fVar138 * fVar265;
  fVar190 = fVar132 * fVar215 + fVar137 * fVar235 + fVar138 * fVar266;
  fVar200 = fVar132 * (float)(auVar162._12_4_ >> 0x18) +
            fVar137 * (float)(auVar165._12_4_ >> 0x18) + fVar138 * (float)(auVar168._12_4_ >> 0x18);
  fVar131 = (float)DAT_01f4bd50;
  fVar55 = DAT_01f4bd50._4_4_;
  fVar95 = DAT_01f4bd50._8_4_;
  fVar96 = DAT_01f4bd50._12_4_;
  uVar48 = -(uint)(fVar131 <= ABS(fVar248));
  uVar50 = -(uint)(fVar55 <= ABS(fVar255));
  uVar52 = -(uint)(fVar95 <= ABS(fVar257));
  uVar53 = -(uint)(fVar96 <= ABS(fVar259));
  auVar251._0_4_ = (uint)fVar248 & uVar48;
  auVar251._4_4_ = (uint)fVar255 & uVar50;
  auVar251._8_4_ = (uint)fVar257 & uVar52;
  auVar251._12_4_ = (uint)fVar259 & uVar53;
  auVar133._0_4_ = ~uVar48 & (uint)fVar131;
  auVar133._4_4_ = ~uVar50 & (uint)fVar55;
  auVar133._8_4_ = ~uVar52 & (uint)fVar95;
  auVar133._12_4_ = ~uVar53 & (uint)fVar96;
  auVar133 = auVar133 | auVar251;
  uVar48 = -(uint)(fVar131 <= ABS(fVar238));
  uVar50 = -(uint)(fVar55 <= ABS(fVar245));
  uVar52 = -(uint)(fVar95 <= ABS(fVar246));
  uVar53 = -(uint)(fVar96 <= ABS(fVar247));
  auVar239._0_4_ = (uint)fVar238 & uVar48;
  auVar239._4_4_ = (uint)fVar245 & uVar50;
  auVar239._8_4_ = (uint)fVar246 & uVar52;
  auVar239._12_4_ = (uint)fVar247 & uVar53;
  auVar140._0_4_ = ~uVar48 & (uint)fVar131;
  auVar140._4_4_ = ~uVar50 & (uint)fVar55;
  auVar140._8_4_ = ~uVar52 & (uint)fVar95;
  auVar140._12_4_ = ~uVar53 & (uint)fVar96;
  auVar140 = auVar140 | auVar239;
  uVar48 = -(uint)(fVar131 <= ABS(fVar154));
  uVar50 = -(uint)(fVar55 <= ABS(fVar181));
  uVar52 = -(uint)(fVar95 <= ABS(fVar182));
  uVar53 = -(uint)(fVar96 <= ABS(fVar118));
  auVar170._0_4_ = (uint)fVar154 & uVar48;
  auVar170._4_4_ = (uint)fVar181 & uVar50;
  auVar170._8_4_ = (uint)fVar182 & uVar52;
  auVar170._12_4_ = (uint)fVar118 & uVar53;
  auVar203._0_4_ = ~uVar48 & (uint)fVar131;
  auVar203._4_4_ = ~uVar50 & (uint)fVar55;
  auVar203._8_4_ = ~uVar52 & (uint)fVar95;
  auVar203._12_4_ = ~uVar53 & (uint)fVar96;
  auVar203 = auVar203 | auVar170;
  auVar63 = rcpps(_DAT_01f4bd50,auVar133);
  fVar131 = auVar63._0_4_;
  fVar96 = auVar63._4_4_;
  fVar117 = auVar63._8_4_;
  fVar132 = auVar63._12_4_;
  fVar131 = (1.0 - auVar133._0_4_ * fVar131) * fVar131 + fVar131;
  fVar96 = (1.0 - auVar133._4_4_ * fVar96) * fVar96 + fVar96;
  fVar117 = (1.0 - auVar133._8_4_ * fVar117) * fVar117 + fVar117;
  fVar132 = (1.0 - auVar133._12_4_ * fVar132) * fVar132 + fVar132;
  auVar63 = rcpps(auVar63,auVar140);
  fVar55 = auVar63._0_4_;
  fVar97 = auVar63._4_4_;
  fVar118 = auVar63._8_4_;
  fVar137 = auVar63._12_4_;
  fVar55 = (1.0 - auVar140._0_4_ * fVar55) * fVar55 + fVar55;
  fVar97 = (1.0 - auVar140._4_4_ * fVar97) * fVar97 + fVar97;
  fVar118 = (1.0 - auVar140._8_4_ * fVar118) * fVar118 + fVar118;
  fVar137 = (1.0 - auVar140._12_4_ * fVar137) * fVar137 + fVar137;
  auVar63 = rcpps(auVar63,auVar203);
  fVar95 = auVar63._0_4_;
  fVar116 = auVar63._4_4_;
  fVar130 = auVar63._8_4_;
  fVar138 = auVar63._12_4_;
  fVar95 = (1.0 - auVar203._0_4_ * fVar95) * fVar95 + fVar95;
  fVar116 = (1.0 - auVar203._4_4_ * fVar116) * fVar116 + fVar116;
  fVar130 = (1.0 - auVar203._8_4_ * fVar130) * fVar130 + fVar130;
  fVar138 = (1.0 - auVar203._12_4_ * fVar138) * fVar138 + fVar138;
  uVar42 = *(ulong *)(prim + uVar44 * 7 + 6);
  uVar94 = (undefined2)(uVar42 >> 0x30);
  auVar66._8_4_ = 0;
  auVar66._0_8_ = uVar42;
  auVar66._12_2_ = uVar94;
  auVar66._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar42 >> 0x20);
  auVar65._12_4_ = auVar66._12_4_;
  auVar65._8_2_ = 0;
  auVar65._0_8_ = uVar42;
  auVar65._10_2_ = uVar94;
  auVar64._10_6_ = auVar65._10_6_;
  auVar64._8_2_ = uVar94;
  auVar64._0_8_ = uVar42;
  uVar94 = (undefined2)(uVar42 >> 0x10);
  auVar33._4_8_ = auVar64._8_8_;
  auVar33._2_2_ = uVar94;
  auVar33._0_2_ = uVar94;
  auVar134._0_8_ =
       CONCAT44(((float)(auVar33._0_4_ >> 0x10) - fVar152) * fVar96,
                ((float)(int)(short)uVar42 - fVar139) * fVar131);
  auVar134._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar153) * fVar117;
  auVar134._12_4_ = ((float)(auVar65._12_4_ >> 0x10) - fVar191) * fVar132;
  uVar42 = *(ulong *)(prim + uVar44 * 9 + 6);
  uVar94 = (undefined2)(uVar42 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar42;
  auVar69._12_2_ = uVar94;
  auVar69._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar42 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar42;
  auVar68._10_2_ = uVar94;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar94;
  auVar67._0_8_ = uVar42;
  uVar94 = (undefined2)(uVar42 >> 0x10);
  auVar34._4_8_ = auVar67._8_8_;
  auVar34._2_2_ = uVar94;
  auVar34._0_2_ = uVar94;
  auVar171._0_4_ = ((float)(int)(short)uVar42 - fVar139) * fVar131;
  auVar171._4_4_ = ((float)(auVar34._0_4_ >> 0x10) - fVar152) * fVar96;
  auVar171._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar153) * fVar117;
  auVar171._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar191) * fVar132;
  uVar42 = *(ulong *)(prim + uVar44 * 0xe + 6);
  uVar94 = (undefined2)(uVar42 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar42;
  auVar72._12_2_ = uVar94;
  auVar72._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar42 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar42;
  auVar71._10_2_ = uVar94;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar94;
  auVar70._0_8_ = uVar42;
  uVar94 = (undefined2)(uVar42 >> 0x10);
  auVar35._4_8_ = auVar70._8_8_;
  auVar35._2_2_ = uVar94;
  auVar35._0_2_ = uVar94;
  auVar99._0_8_ =
       CONCAT44(((float)(auVar35._0_4_ >> 0x10) - fVar216) * fVar97,
                ((float)(int)(short)uVar42 - fVar201) * fVar55);
  auVar99._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar224) * fVar118;
  auVar99._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar225) * fVar137;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  uVar94 = (undefined2)(uVar42 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar42;
  auVar75._12_2_ = uVar94;
  auVar75._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar42 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar42;
  auVar74._10_2_ = uVar94;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar94;
  auVar73._0_8_ = uVar42;
  uVar94 = (undefined2)(uVar42 >> 0x10);
  auVar36._4_8_ = auVar73._8_8_;
  auVar36._2_2_ = uVar94;
  auVar36._0_2_ = uVar94;
  auVar192._0_4_ = ((float)(int)(short)uVar42 - fVar201) * fVar55;
  auVar192._4_4_ = ((float)(auVar36._0_4_ >> 0x10) - fVar216) * fVar97;
  auVar192._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar224) * fVar118;
  auVar192._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar225) * fVar137;
  uVar42 = *(ulong *)(prim + uVar44 * 0x15 + 6);
  uVar94 = (undefined2)(uVar42 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar42;
  auVar78._12_2_ = uVar94;
  auVar78._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar42 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar42;
  auVar77._10_2_ = uVar94;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar94;
  auVar76._0_8_ = uVar42;
  uVar94 = (undefined2)(uVar42 >> 0x10);
  auVar37._4_8_ = auVar76._8_8_;
  auVar37._2_2_ = uVar94;
  auVar37._0_2_ = uVar94;
  auVar79._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar189) * fVar116,
                ((float)(int)(short)uVar42 - fVar183) * fVar95);
  auVar79._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar190) * fVar130;
  auVar79._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar200) * fVar138;
  uVar42 = *(ulong *)(prim + uVar44 * 0x17 + 6);
  uVar94 = (undefined2)(uVar42 >> 0x30);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar42;
  auVar186._12_2_ = uVar94;
  auVar186._14_2_ = uVar94;
  uVar94 = (undefined2)(uVar42 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar42;
  auVar185._10_2_ = uVar94;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar94;
  auVar184._0_8_ = uVar42;
  uVar94 = (undefined2)(uVar42 >> 0x10);
  auVar38._4_8_ = auVar184._8_8_;
  auVar38._2_2_ = uVar94;
  auVar38._0_2_ = uVar94;
  auVar187._0_4_ = ((float)(int)(short)uVar42 - fVar183) * fVar95;
  auVar187._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar189) * fVar116;
  auVar187._8_4_ = ((float)(auVar184._8_4_ >> 0x10) - fVar190) * fVar130;
  auVar187._12_4_ = ((float)(auVar185._12_4_ >> 0x10) - fVar200) * fVar138;
  auVar204._8_4_ = auVar134._8_4_;
  auVar204._0_8_ = auVar134._0_8_;
  auVar204._12_4_ = auVar134._12_4_;
  auVar205 = minps(auVar204,auVar171);
  auVar119._8_4_ = auVar99._8_4_;
  auVar119._0_8_ = auVar99._0_8_;
  auVar119._12_4_ = auVar99._12_4_;
  auVar63 = minps(auVar119,auVar192);
  auVar205 = maxps(auVar205,auVar63);
  auVar120._8_4_ = auVar79._8_4_;
  auVar120._0_8_ = auVar79._0_8_;
  auVar120._12_4_ = auVar79._12_4_;
  auVar63 = minps(auVar120,auVar187);
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar141._4_4_ = uVar4;
  auVar141._0_4_ = uVar4;
  auVar141._8_4_ = uVar4;
  auVar141._12_4_ = uVar4;
  auVar63 = maxps(auVar63,auVar141);
  auVar63 = maxps(auVar205,auVar63);
  local_188 = auVar63._0_4_ * 0.99999964;
  fStack_184 = auVar63._4_4_ * 0.99999964;
  fStack_180 = auVar63._8_4_ * 0.99999964;
  fStack_17c = auVar63._12_4_ * 0.99999964;
  auVar205 = maxps(auVar134,auVar171);
  auVar63 = maxps(auVar99,auVar192);
  auVar205 = minps(auVar205,auVar63);
  auVar63 = maxps(auVar79,auVar187);
  fVar131 = ray->tfar;
  auVar100._4_4_ = fVar131;
  auVar100._0_4_ = fVar131;
  auVar100._8_4_ = fVar131;
  auVar100._12_4_ = fVar131;
  auVar63 = minps(auVar63,auVar100);
  auVar63 = minps(auVar205,auVar63);
  auVar101._0_4_ = -(uint)(PVar3 != (Primitive)0x0 && local_188 <= auVar63._0_4_ * 1.0000004);
  auVar101._4_4_ = -(uint)(1 < (byte)PVar3 && fStack_184 <= auVar63._4_4_ * 1.0000004);
  auVar101._8_4_ = -(uint)(2 < (byte)PVar3 && fStack_180 <= auVar63._8_4_ * 1.0000004);
  auVar101._12_4_ = -(uint)(3 < (byte)PVar3 && fStack_17c <= auVar63._12_4_ * 1.0000004);
  uVar48 = movmskps((int)(uVar44 * 0x15),auVar101);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
LAB_0030cad3:
  local_290 = (ulong)uVar48;
  if (local_290 == 0) {
LAB_0030ea71:
    return local_290 != 0;
  }
  lVar9 = 0;
  if (local_290 != 0) {
    for (; (uVar48 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  local_3d0 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[local_3d0].ptr;
  uVar42 = *(ulong *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar46 = (ulong)*(uint *)(uVar42 + _Var6 * *(uint *)(prim + lVar9 * 4 + 6));
  p_Var43 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var8 + uVar46 * (long)pvVar7);
  fVar131 = *pfVar1;
  fVar55 = pfVar1[1];
  fVar95 = pfVar1[2];
  fVar96 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar46 + 1) * (long)pvVar7);
  fVar97 = *pfVar1;
  fVar116 = pfVar1[1];
  fVar117 = pfVar1[2];
  fVar118 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (uVar46 + 2) * (long)pvVar7);
  fVar130 = *pfVar1;
  fVar132 = pfVar1[1];
  fVar137 = pfVar1[2];
  fVar138 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar46 + 3));
  fVar139 = *pfVar1;
  fVar152 = pfVar1[1];
  fVar153 = pfVar1[2];
  fVar191 = pfVar1[3];
  lVar9 = *(long *)&pGVar5[1].time_range.upper;
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * uVar46);
  fVar183 = *pfVar1;
  fVar189 = pfVar1[1];
  fVar190 = pfVar1[2];
  fVar200 = pfVar1[3];
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * (uVar46 + 1));
  fVar154 = *pfVar1;
  fVar181 = pfVar1[1];
  fVar182 = pfVar1[2];
  fVar201 = pfVar1[3];
  uVar44 = local_290 - 1 & local_290;
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * (uVar46 + 2));
  fVar202 = *pfVar1;
  fVar214 = pfVar1[1];
  fVar215 = pfVar1[2];
  fVar216 = pfVar1[3];
  lVar10 = 0;
  if (uVar44 != 0) {
    for (; (uVar44 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar1 = (float *)(lVar9 + (long)p_Var43 * (uVar46 + 3));
  fVar224 = *pfVar1;
  fVar225 = pfVar1[1];
  fVar226 = pfVar1[2];
  fVar233 = pfVar1[3];
  if ((uVar44 != 0) && (uVar46 = uVar44 - 1 & uVar44, uVar46 != 0)) {
    lVar9 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
      }
    }
    uVar42 = (ulong)*(uint *)(uVar42 + _Var6 * *(uint *)(prim + lVar9 * 4 + 6));
  }
  fVar235 = fVar202 * 0.0 + fVar224 * -0.0 + fVar154 + fVar183 * -0.0;
  fVar238 = fVar214 * 0.0 + fVar225 * -0.0 + fVar181 + fVar189 * -0.0;
  fVar245 = fVar215 * 0.0 + fVar226 * -0.0 + fVar182 + fVar190 * -0.0;
  fVar246 = fVar216 * 0.0 + fVar233 * -0.0 + fVar201 + fVar200 * -0.0;
  fVar247 = (fVar202 * 0.5 + fVar224 * 0.0 + fVar154 * 0.0) - fVar183 * 0.5;
  fVar248 = (fVar214 * 0.5 + fVar225 * 0.0 + fVar181 * 0.0) - fVar189 * 0.5;
  fVar255 = (fVar215 * 0.5 + fVar226 * 0.0 + fVar182 * 0.0) - fVar190 * 0.5;
  fVar257 = (fVar216 * 0.5 + fVar233 * 0.0 + fVar201 * 0.0) - fVar200 * 0.5;
  fVar249 = (fVar130 * 0.5 + fVar139 * 0.0 + fVar97 * 0.0) - fVar131 * 0.5;
  fVar256 = (fVar132 * 0.5 + fVar152 * 0.0 + fVar116 * 0.0) - fVar55 * 0.5;
  fVar258 = (fVar137 * 0.5 + fVar153 * 0.0 + fVar117 * 0.0) - fVar95 * 0.5;
  fVar260 = (fVar138 * 0.5 + fVar191 * 0.0 + fVar118 * 0.0) - fVar96 * 0.5;
  fVar227 = fVar130 * 0.0 + fVar139 * -0.0 + fVar97 + fVar131 * -0.0;
  fVar234 = fVar132 * 0.0 + fVar152 * -0.0 + fVar116 + fVar55 * -0.0;
  fVar236 = fVar137 * 0.0 + fVar153 * -0.0 + fVar117 + fVar95 * -0.0;
  fVar237 = fVar138 * 0.0 + fVar191 * -0.0 + fVar118 + fVar96 * -0.0;
  fVar259 = fVar224 * -0.0 + fVar202 + fVar154 * 0.0 + fVar183 * -0.0;
  fVar261 = fVar225 * -0.0 + fVar214 + fVar181 * 0.0 + fVar189 * -0.0;
  fVar265 = fVar226 * -0.0 + fVar215 + fVar182 * 0.0 + fVar190 * -0.0;
  fVar266 = fVar233 * -0.0 + fVar216 + fVar201 * 0.0 + fVar200 * -0.0;
  fVar183 = fVar183 * 0.0 + ((fVar224 * 0.5 + fVar202 * 0.0) - fVar154 * 0.5);
  fVar189 = fVar189 * 0.0 + ((fVar225 * 0.5 + fVar214 * 0.0) - fVar181 * 0.5);
  fVar190 = fVar190 * 0.0 + ((fVar226 * 0.5 + fVar215 * 0.0) - fVar182 * 0.5);
  fVar200 = fVar200 * 0.0 + ((fVar233 * 0.5 + fVar216 * 0.0) - fVar201 * 0.5);
  fVar154 = fVar139 * -0.0 + fVar130 + fVar97 * 0.0 + fVar131 * -0.0;
  fVar181 = fVar152 * -0.0 + fVar132 + fVar116 * 0.0 + fVar55 * -0.0;
  fVar182 = fVar153 * -0.0 + fVar137 + fVar117 * 0.0 + fVar95 * -0.0;
  fVar201 = fVar191 * -0.0 + fVar138 + fVar118 * 0.0 + fVar96 * -0.0;
  fVar131 = fVar131 * 0.0 + ((fVar139 * 0.5 + fVar130 * 0.0) - fVar97 * 0.5);
  fVar55 = fVar55 * 0.0 + ((fVar152 * 0.5 + fVar132 * 0.0) - fVar116 * 0.5);
  fVar95 = fVar95 * 0.0 + ((fVar153 * 0.5 + fVar137 * 0.0) - fVar117 * 0.5);
  fVar96 = fVar96 * 0.0 + ((fVar191 * 0.5 + fVar138 * 0.0) - fVar118 * 0.5);
  fVar214 = fVar248 * fVar227 - fVar234 * fVar247;
  fVar216 = fVar255 * fVar234 - fVar236 * fVar248;
  fVar224 = fVar247 * fVar236 - fVar227 * fVar255;
  fVar225 = fVar257 * fVar237 - fVar237 * fVar257;
  fVar139 = fVar248 * fVar249 - fVar256 * fVar247;
  fVar153 = fVar255 * fVar256 - fVar258 * fVar248;
  fVar191 = fVar247 * fVar258 - fVar249 * fVar255;
  fVar118 = fVar189 * fVar154 - fVar181 * fVar183;
  fVar132 = fVar190 * fVar181 - fVar182 * fVar189;
  fVar137 = fVar183 * fVar182 - fVar154 * fVar190;
  fVar138 = fVar200 * fVar201 - fVar201 * fVar200;
  fVar97 = fVar189 * fVar131 - fVar55 * fVar183;
  fVar55 = fVar190 * fVar55 - fVar95 * fVar189;
  fVar95 = fVar183 * fVar95 - fVar131 * fVar190;
  fVar182 = fVar224 * fVar224 + fVar216 * fVar216 + fVar214 * fVar214;
  auVar205 = ZEXT416((uint)fVar182);
  auVar63 = rsqrtss(ZEXT416((uint)fVar182),auVar205);
  fVar131 = auVar63._0_4_;
  fVar201 = fVar131 * 1.5 - fVar131 * fVar131 * fVar182 * 0.5 * fVar131;
  fVar215 = fVar214 * fVar139 + fVar224 * fVar191 + fVar216 * fVar153;
  fVar131 = fVar225 * fVar201;
  auVar63 = rcpss(auVar205,auVar205);
  fVar152 = (2.0 - fVar182 * auVar63._0_4_) * auVar63._0_4_;
  fVar154 = fVar137 * fVar137 + fVar132 * fVar132 + fVar118 * fVar118;
  auVar63 = ZEXT416((uint)fVar154);
  auVar205 = rsqrtss(ZEXT416((uint)fVar154),auVar63);
  fVar116 = auVar205._0_4_;
  fVar130 = fVar116 * 1.5 - fVar116 * fVar116 * fVar154 * 0.5 * fVar116;
  fVar202 = fVar118 * fVar97 + fVar137 * fVar95 + fVar132 * fVar55;
  fVar117 = fVar138 * fVar130;
  auVar63 = rcpss(auVar63,auVar63);
  fVar116 = (2.0 - fVar154 * auVar63._0_4_) * auVar63._0_4_;
  local_358 = fVar246 * fVar216 * fVar201;
  fStack_354 = fVar246 * fVar224 * fVar201;
  fStack_350 = fVar246 * fVar214 * fVar201;
  fStack_34c = fVar246 * fVar131;
  local_368 = fVar235 - local_358;
  fStack_364 = fVar238 - fStack_354;
  fStack_360 = fVar245 - fStack_350;
  fStack_35c = fVar246 - fStack_34c;
  fVar153 = fVar246 * fVar152 * (fVar182 * fVar153 - fVar215 * fVar216) * fVar201 +
            fVar257 * fVar216 * fVar201;
  fVar191 = fVar246 * fVar152 * (fVar182 * fVar191 - fVar215 * fVar224) * fVar201 +
            fVar257 * fVar224 * fVar201;
  fVar181 = fVar246 * fVar152 * (fVar182 * fVar139 - fVar215 * fVar214) * fVar201 +
            fVar257 * fVar214 * fVar201;
  fVar152 = fVar246 * fVar152 * (fVar182 * (fVar257 * fVar260 - fVar260 * fVar257) -
                                fVar215 * fVar225) * fVar201 + fVar257 * fVar131;
  local_358 = local_358 + fVar235;
  fStack_354 = fStack_354 + fVar238;
  fStack_350 = fStack_350 + fVar245;
  fStack_34c = fStack_34c + fVar246;
  local_3c8 = fVar266 * fVar132 * fVar130;
  fStack_3c4 = fVar266 * fVar137 * fVar130;
  fStack_3c0 = fVar266 * fVar118 * fVar130;
  fStack_3bc = fVar266 * fVar117;
  local_388 = fVar259 - local_3c8;
  fStack_384 = fVar261 - fStack_3c4;
  fStack_380 = fVar265 - fStack_3c0;
  fStack_37c = fVar266 - fStack_3bc;
  fVar131 = fVar266 * fVar116 * (fVar154 * fVar55 - fVar202 * fVar132) * fVar130 +
            fVar200 * fVar132 * fVar130;
  fVar55 = fVar266 * fVar116 * (fVar154 * fVar95 - fVar202 * fVar137) * fVar130 +
           fVar200 * fVar137 * fVar130;
  fVar95 = fVar266 * fVar116 * (fVar154 * fVar97 - fVar202 * fVar118) * fVar130 +
           fVar200 * fVar118 * fVar130;
  fVar96 = fVar266 * fVar116 * (fVar154 * (fVar200 * fVar96 - fVar96 * fVar200) - fVar202 * fVar138)
                     * fVar130 + fVar200 * fVar117;
  local_3c8 = local_3c8 + fVar259;
  fStack_3c4 = fStack_3c4 + fVar261;
  fStack_3c0 = fStack_3c0 + fVar265;
  fStack_3bc = fStack_3bc + fVar266;
  local_378 = (fVar247 - fVar153) * 0.33333334 + local_368;
  fStack_374 = (fVar248 - fVar191) * 0.33333334 + fStack_364;
  fStack_370 = (fVar255 - fVar181) * 0.33333334 + fStack_360;
  fStack_36c = (fVar257 - fVar152) * 0.33333334 + fStack_35c;
  local_398 = local_388 - (fVar183 - fVar131) * 0.33333334;
  fStack_394 = fStack_384 - (fVar189 - fVar55) * 0.33333334;
  fStack_390 = fStack_380 - (fVar190 - fVar95) * 0.33333334;
  fStack_38c = fStack_37c - (fVar200 - fVar96) * 0.33333334;
  local_3a8 = local_3c8 - (fVar131 + fVar183) * 0.33333334;
  fStack_3a4 = fStack_3c4 - (fVar55 + fVar189) * 0.33333334;
  fStack_3a0 = fStack_3c0 - (fVar95 + fVar190) * 0.33333334;
  fStack_39c = fStack_3bc - (fVar96 + fVar200) * 0.33333334;
  fVar131 = (ray->org).field_0.m128[0];
  fVar55 = (ray->org).field_0.m128[1];
  fVar95 = (ray->org).field_0.m128[2];
  fVar96 = (pre->ray_space).vx.field_0.m128[0];
  fVar97 = (pre->ray_space).vx.field_0.m128[1];
  fVar116 = (pre->ray_space).vy.field_0.m128[0];
  fVar117 = (pre->ray_space).vy.field_0.m128[1];
  fVar118 = (pre->ray_space).vz.field_0.m128[0];
  fVar130 = (pre->ray_space).vz.field_0.m128[1];
  fVar190 = (local_368 - fVar131) * fVar96 +
            (fStack_364 - fVar55) * fVar116 + (fStack_360 - fVar95) * fVar118;
  fVar200 = (local_368 - fVar131) * fVar97 +
            (fStack_364 - fVar55) * fVar117 + (fStack_360 - fVar95) * fVar130;
  local_2d8 = CONCAT44(fVar200,fVar190);
  fVar183 = (local_378 - fVar131) * fVar96 +
            (fStack_374 - fVar55) * fVar116 + (fStack_370 - fVar95) * fVar118;
  fVar189 = (local_378 - fVar131) * fVar97 +
            (fStack_374 - fVar55) * fVar117 + (fStack_370 - fVar95) * fVar130;
  uVar250 = CONCAT44(fVar189,fVar183);
  fVar138 = (local_398 - fVar131) * fVar96 +
            (fStack_394 - fVar55) * fVar116 + (fStack_390 - fVar95) * fVar118;
  fVar139 = (local_398 - fVar131) * fVar97 +
            (fStack_394 - fVar55) * fVar117 + (fStack_390 - fVar95) * fVar130;
  local_2c8 = CONCAT44(fVar139,fVar138);
  fVar132 = (local_388 - fVar131) * fVar96 +
            (fStack_384 - fVar55) * fVar116 + (fStack_380 - fVar95) * fVar118;
  fVar137 = (local_388 - fVar131) * fVar97 +
            (fStack_384 - fVar55) * fVar117 + (fStack_380 - fVar95) * fVar130;
  uVar98 = CONCAT44(fVar137,fVar132);
  local_328 = (local_358 - fVar131) * fVar96 +
              (fStack_354 - fVar55) * fVar116 + (fStack_350 - fVar95) * fVar118;
  fStack_324 = (local_358 - fVar131) * fVar97 +
               (fStack_354 - fVar55) * fVar117 + (fStack_350 - fVar95) * fVar130;
  local_218 = (fVar153 + fVar247) * 0.33333334 + local_358;
  fStack_214 = (fVar191 + fVar248) * 0.33333334 + fStack_354;
  fStack_210 = (fVar181 + fVar255) * 0.33333334 + fStack_350;
  fStack_20c = (fVar152 + fVar257) * 0.33333334 + fStack_34c;
  fVar152 = (local_218 - fVar131) * fVar96 +
            (fStack_214 - fVar55) * fVar116 + (fStack_210 - fVar95) * fVar118;
  fVar153 = (local_218 - fVar131) * fVar97 +
            (fStack_214 - fVar55) * fVar117 + (fStack_210 - fVar95) * fVar130;
  local_338._0_8_ = CONCAT44(fVar153,fVar152);
  local_318 = (local_3a8 - fVar131) * fVar96 +
              (fStack_3a4 - fVar55) * fVar116 + (fStack_3a0 - fVar95) * fVar118;
  fStack_314 = (local_3a8 - fVar131) * fVar97 +
               (fStack_3a4 - fVar55) * fVar117 + (fStack_3a0 - fVar95) * fVar130;
  local_348 = (local_3c8 - fVar131) * fVar96 +
              (fStack_3c4 - fVar55) * fVar116 + (fStack_3c0 - fVar95) * fVar118;
  fStack_344 = (local_3c8 - fVar131) * fVar97 +
               (fStack_3c4 - fVar55) * fVar117 + (fStack_3c0 - fVar95) * fVar130;
  local_b8._12_4_ = fStack_344;
  local_b8._8_4_ = local_348;
  auVar240._8_8_ = local_338._0_8_;
  auVar240._0_8_ = uVar250;
  local_b8._0_8_ = uVar98;
  auVar80._8_4_ = local_328;
  auVar80._0_8_ = local_2d8;
  auVar80._12_4_ = fStack_324;
  auVar63 = minps(auVar80,auVar240);
  auVar102._8_4_ = local_318;
  auVar102._0_8_ = local_2c8;
  auVar102._12_4_ = fStack_314;
  auVar205 = minps(auVar102,local_b8);
  auVar63 = minps(auVar63,auVar205);
  auVar103._4_4_ = fVar200;
  auVar103._0_4_ = fVar190;
  auVar103._8_4_ = local_328;
  auVar103._12_4_ = fStack_324;
  auVar205 = maxps(auVar103,auVar240);
  auVar121._4_4_ = fVar139;
  auVar121._0_4_ = fVar138;
  auVar121._8_4_ = local_318;
  auVar121._12_4_ = fStack_314;
  auVar122 = maxps(auVar121,local_b8);
  auVar104 = maxps(auVar205,auVar122);
  auVar14._4_8_ = auVar122._8_8_;
  auVar14._0_4_ = auVar63._4_4_;
  auVar123._0_8_ = auVar14._0_8_ << 0x20;
  auVar123._8_4_ = auVar63._8_4_;
  auVar123._12_4_ = auVar63._12_4_;
  auVar124._8_8_ = auVar63._8_8_;
  auVar124._0_8_ = auVar123._8_8_;
  auVar205 = minps(auVar63,auVar124);
  auVar15._4_8_ = auVar63._8_8_;
  auVar15._0_4_ = auVar104._4_4_;
  auVar125._0_8_ = auVar15._0_8_ << 0x20;
  auVar125._8_4_ = auVar104._8_4_;
  auVar125._12_4_ = auVar104._12_4_;
  auVar126._8_8_ = auVar104._8_8_;
  auVar126._0_8_ = auVar125._8_8_;
  auVar63 = maxps(auVar104,auVar126);
  auVar81._0_8_ = auVar205._0_8_ & 0x7fffffff7fffffff;
  auVar81._8_4_ = auVar205._8_4_ & 0x7fffffff;
  auVar81._12_4_ = auVar205._12_4_ & 0x7fffffff;
  auVar105._0_8_ = auVar63._0_8_ & 0x7fffffff7fffffff;
  auVar105._8_4_ = auVar63._8_4_ & 0x7fffffff;
  auVar105._12_4_ = auVar63._12_4_ & 0x7fffffff;
  auVar63 = maxps(auVar81,auVar105);
  fStack_c4 = auVar63._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar63._0_4_) {
    local_c8 = auVar63._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  register0x000015c8 = local_2d8;
  register0x00001388 = uVar250;
  local_2e8 = uVar250;
  register0x00001308 = local_2c8;
  local_2f8 = local_2c8;
  register0x00001548 = uVar98;
  local_308 = uVar98;
  local_338._8_8_ = local_338._0_8_;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  _local_298 = CONCAT44(fStack_324,local_328);
  local_88 = fVar183 - fVar190;
  fStack_84 = fVar189 - fVar200;
  fStack_80 = fVar152 - local_328;
  fStack_7c = fVar153 - fStack_324;
  local_98 = fVar138 - fVar183;
  fStack_94 = fVar139 - fVar189;
  fStack_90 = local_318 - fVar152;
  fStack_8c = fStack_314 - fVar153;
  fStack_2b4 = fStack_314;
  local_2b8 = local_318;
  uStack_2b0 = local_338._0_8_;
  local_a8 = fVar132 - fVar138;
  fStack_a4 = fVar137 - fVar139;
  fStack_a0 = local_348 - local_318;
  fStack_9c = fStack_344 - fStack_314;
  local_198 = local_358 - local_368;
  fStack_194 = fStack_354 - fStack_364;
  fStack_190 = fStack_350 - fStack_360;
  fStack_18c = fStack_34c - fStack_35c;
  local_1a8 = local_218 - local_378;
  fStack_1a4 = fStack_214 - fStack_374;
  fStack_1a0 = fStack_210 - fStack_370;
  fStack_19c = fStack_20c - fStack_36c;
  local_1b8 = local_3a8 - local_398;
  fStack_1b4 = fStack_3a4 - fStack_394;
  fStack_1b0 = fStack_3a0 - fStack_390;
  fStack_1ac = fStack_39c - fStack_38c;
  local_1c8 = local_3c8 - local_388;
  fStack_1c4 = fStack_3c4 - fStack_384;
  fStack_1c0 = fStack_3c0 - fStack_380;
  fStack_1bc = fStack_3bc - fStack_37c;
  bVar45 = 0;
  uVar46 = 0;
  fVar131 = 0.0;
  fVar55 = 1.0;
  fVar97 = 0.0;
  fVar116 = 0.0;
  fVar95 = 0.0;
  fVar96 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  fStack_340 = local_348;
  fStack_33c = fStack_344;
  fStack_320 = local_328;
  fStack_31c = fStack_324;
  fStack_310 = local_318;
  fStack_30c = fStack_314;
  local_2a8 = local_2d8;
LAB_0030d34b:
  fVar117 = 1.0 - fVar131;
  fVar118 = 1.0 - fVar131;
  fVar130 = 1.0 - fVar55;
  fVar132 = 1.0 - fVar55;
  fVar182 = local_2d8._0_4_ * fVar117 + local_328 * fVar131;
  fVar224 = local_2d8._4_4_ * fVar118 + fStack_324 * fVar131;
  fVar225 = local_2d8._8_4_ * fVar130 + fStack_320 * fVar55;
  fVar226 = local_2d8._12_4_ * fVar132 + fStack_31c * fVar55;
  fVar139 = local_2e8._0_4_ * fVar117 + local_338._0_4_ * fVar131;
  fVar214 = local_2e8._4_4_ * fVar118 + local_338._4_4_ * fVar131;
  fVar215 = local_2e8._8_4_ * fVar130 + local_338._8_4_ * fVar55;
  fVar216 = local_2e8._12_4_ * fVar132 + local_338._12_4_ * fVar55;
  fVar245 = local_2f8._0_4_ * fVar117 + local_318 * fVar131;
  fVar246 = local_2f8._4_4_ * fVar118 + fStack_314 * fVar131;
  fVar227 = local_2f8._8_4_ * fVar130 + fStack_310 * fVar55;
  fVar234 = local_2f8._12_4_ * fVar132 + fStack_30c * fVar55;
  fVar233 = fVar117 * local_308._0_4_ + fVar131 * local_348;
  fVar235 = fVar118 * local_308._4_4_ + fVar131 * fStack_344;
  fVar238 = fVar130 * local_308._8_4_ + fVar55 * fStack_340;
  fVar255 = fVar132 * local_308._12_4_ + fVar55 * fStack_33c;
  fVar257 = (fVar96 - fVar95) * 0.11111111;
  fVar259 = (fVar96 - fVar95) * 0.0 + fVar95;
  fVar261 = (fVar96 - fVar95) * 0.33333334 + fVar95;
  fVar265 = (fVar96 - fVar95) * 0.6666667 + fVar95;
  fVar266 = (fVar96 - fVar95) * 1.0 + fVar95;
  fVar118 = 1.0 - fVar259;
  fVar132 = 1.0 - fVar261;
  fVar138 = 1.0 - fVar265;
  fVar152 = 1.0 - fVar266;
  fVar153 = fVar139 * fVar118 + fVar245 * fVar259;
  fVar191 = fVar139 * fVar132 + fVar245 * fVar261;
  fVar183 = fVar139 * fVar138 + fVar245 * fVar265;
  fVar189 = fVar139 * fVar152 + fVar245 * fVar266;
  fVar190 = fVar214 * fVar118 + fVar246 * fVar259;
  fVar200 = fVar214 * fVar132 + fVar246 * fVar261;
  fVar154 = fVar214 * fVar138 + fVar246 * fVar265;
  fVar181 = fVar214 * fVar152 + fVar246 * fVar266;
  fVar117 = (fVar182 * fVar118 + fVar139 * fVar259) * fVar118 + fVar259 * fVar153;
  fVar130 = (fVar182 * fVar132 + fVar139 * fVar261) * fVar132 + fVar261 * fVar191;
  fVar137 = (fVar182 * fVar138 + fVar139 * fVar265) * fVar138 + fVar265 * fVar183;
  fVar139 = (fVar182 * fVar152 + fVar139 * fVar266) * fVar152 + fVar266 * fVar189;
  fVar182 = (fVar224 * fVar118 + fVar214 * fVar259) * fVar118 + fVar259 * fVar190;
  fVar201 = (fVar224 * fVar132 + fVar214 * fVar261) * fVar132 + fVar261 * fVar200;
  fVar202 = (fVar224 * fVar138 + fVar214 * fVar265) * fVar138 + fVar265 * fVar154;
  fVar214 = (fVar224 * fVar152 + fVar214 * fVar266) * fVar152 + fVar266 * fVar181;
  fVar153 = fVar153 * fVar118 + (fVar245 * fVar118 + fVar233 * fVar259) * fVar259;
  fVar191 = fVar191 * fVar132 + (fVar245 * fVar132 + fVar233 * fVar261) * fVar261;
  fVar183 = fVar183 * fVar138 + (fVar245 * fVar138 + fVar233 * fVar265) * fVar265;
  fVar189 = fVar189 * fVar152 + (fVar245 * fVar152 + fVar233 * fVar266) * fVar266;
  fVar190 = fVar190 * fVar118 + (fVar246 * fVar118 + fVar235 * fVar259) * fVar259;
  fVar200 = fVar200 * fVar132 + (fVar246 * fVar132 + fVar235 * fVar261) * fVar261;
  fVar154 = fVar154 * fVar138 + (fVar246 * fVar138 + fVar235 * fVar265) * fVar265;
  fVar181 = fVar181 * fVar152 + (fVar246 * fVar152 + fVar235 * fVar266) * fVar266;
  local_258 = fVar118 * fVar117 + fVar259 * fVar153;
  fStack_254 = fVar132 * fVar130 + fVar261 * fVar191;
  fStack_250 = fVar138 * fVar137 + fVar265 * fVar183;
  fStack_24c = fVar152 * fVar139 + fVar266 * fVar189;
  local_148 = fVar118 * fVar182 + fVar259 * fVar190;
  fStack_144 = fVar132 * fVar201 + fVar261 * fVar200;
  fStack_140 = fVar138 * fVar202 + fVar265 * fVar154;
  fStack_13c = fVar152 * fVar214 + fVar266 * fVar181;
  fVar191 = (fVar191 - fVar130) * 3.0 * fVar257;
  fVar183 = (fVar183 - fVar137) * 3.0 * fVar257;
  fVar189 = (fVar189 - fVar139) * 3.0 * fVar257;
  fVar200 = (fVar200 - fVar201) * 3.0 * fVar257;
  fVar154 = (fVar154 - fVar202) * 3.0 * fVar257;
  fVar181 = (fVar181 - fVar214) * 3.0 * fVar257;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar153 - fVar117) * 3.0 * fVar257;
  fStack_234 = fStack_254 + fVar191;
  fStack_230 = fStack_250 + fVar183;
  fStack_22c = fStack_24c + fVar189;
  fVar117 = local_148 + (fVar190 - fVar182) * 3.0 * fVar257;
  fVar130 = fStack_144 + fVar200;
  fVar137 = fStack_140 + fVar154;
  fVar139 = fStack_13c + fVar181;
  local_248._0_4_ = fStack_254 - fVar191;
  local_248._4_4_ = fStack_250 - fVar183;
  local_248._8_4_ = fStack_24c - fVar189;
  local_248._12_4_ = 0;
  local_408._0_4_ = fStack_144 - fVar200;
  local_408._4_4_ = fStack_140 - fVar154;
  fStack_400 = fStack_13c - fVar181;
  fStack_3fc = 0.0;
  fVar153 = fVar215 * fVar118 + fVar227 * fVar259;
  fVar191 = fVar215 * fVar132 + fVar227 * fVar261;
  fVar183 = fVar215 * fVar138 + fVar227 * fVar265;
  fVar189 = fVar215 * fVar152 + fVar227 * fVar266;
  fVar190 = fVar216 * fVar118 + fVar234 * fVar259;
  fVar200 = fVar216 * fVar132 + fVar234 * fVar261;
  fVar154 = fVar216 * fVar138 + fVar234 * fVar265;
  fVar181 = fVar216 * fVar152 + fVar234 * fVar266;
  fVar182 = (fVar225 * fVar118 + fVar215 * fVar259) * fVar118 + fVar259 * fVar153;
  fVar201 = (fVar225 * fVar132 + fVar215 * fVar261) * fVar132 + fVar261 * fVar191;
  fVar202 = (fVar225 * fVar138 + fVar215 * fVar265) * fVar138 + fVar265 * fVar183;
  fVar214 = (fVar225 * fVar152 + fVar215 * fVar266) * fVar152 + fVar266 * fVar189;
  fVar245 = (fVar226 * fVar118 + fVar216 * fVar259) * fVar118 + fVar259 * fVar190;
  fVar246 = (fVar226 * fVar132 + fVar216 * fVar261) * fVar132 + fVar261 * fVar200;
  fVar247 = (fVar226 * fVar138 + fVar216 * fVar265) * fVar138 + fVar265 * fVar154;
  fVar248 = (fVar226 * fVar152 + fVar216 * fVar266) * fVar152 + fVar266 * fVar181;
  fVar215 = fVar153 * fVar118 + (fVar227 * fVar118 + fVar238 * fVar259) * fVar259;
  fVar216 = fVar191 * fVar132 + (fVar227 * fVar132 + fVar238 * fVar261) * fVar261;
  fVar224 = fVar183 * fVar138 + (fVar227 * fVar138 + fVar238 * fVar265) * fVar265;
  fVar225 = fVar189 * fVar152 + (fVar227 * fVar152 + fVar238 * fVar266) * fVar266;
  fVar226 = fVar190 * fVar118 + (fVar234 * fVar118 + fVar255 * fVar259) * fVar259;
  fVar233 = fVar200 * fVar132 + (fVar234 * fVar132 + fVar255 * fVar261) * fVar261;
  fVar235 = fVar154 * fVar138 + (fVar234 * fVar138 + fVar255 * fVar265) * fVar265;
  fVar238 = fVar181 * fVar152 + (fVar234 * fVar152 + fVar255 * fVar266) * fVar266;
  fVar190 = fVar118 * fVar182 + fVar259 * fVar215;
  fVar200 = fVar132 * fVar201 + fVar261 * fVar216;
  fVar154 = fVar138 * fVar202 + fVar265 * fVar224;
  fVar181 = fVar152 * fVar214 + fVar266 * fVar225;
  fVar153 = fVar118 * fVar245 + fVar259 * fVar226;
  fVar191 = fVar132 * fVar246 + fVar261 * fVar233;
  fVar183 = fVar138 * fVar247 + fVar265 * fVar235;
  fVar189 = fVar152 * fVar248 + fVar266 * fVar238;
  fVar118 = (fVar216 - fVar201) * 3.0 * fVar257;
  fVar132 = (fVar224 - fVar202) * 3.0 * fVar257;
  fVar138 = (fVar225 - fVar214) * 3.0 * fVar257;
  fVar152 = (fVar233 - fVar246) * 3.0 * fVar257;
  fVar201 = (fVar235 - fVar247) * 3.0 * fVar257;
  fVar202 = (fVar238 - fVar248) * 3.0 * fVar257;
  local_f8._4_4_ = fVar154;
  local_f8._0_4_ = fVar200;
  local_f8._8_4_ = fVar181;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar183;
  local_118._0_4_ = fVar191;
  local_118._8_4_ = fVar189;
  local_118._12_4_ = 0;
  local_138 = fVar190 + (fVar215 - fVar182) * 3.0 * fVar257;
  fStack_134 = fVar200 + fVar118;
  fStack_130 = fVar154 + fVar132;
  fStack_12c = fVar181 + fVar138;
  local_108 = fVar153 + (fVar226 - fVar245) * 3.0 * fVar257;
  fStack_104 = fVar191 + fVar152;
  fStack_100 = fVar183 + fVar201;
  fStack_fc = fVar189 + fVar202;
  local_d8._0_4_ = fVar200 - fVar118;
  local_d8._4_4_ = fVar154 - fVar132;
  local_d8._8_4_ = fVar181 - fVar138;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar191 - fVar152;
  local_128._4_4_ = fVar183 - fVar201;
  local_128._8_4_ = fVar189 - fVar202;
  local_128._12_4_ = 0;
  fVar118 = (fVar200 - fStack_254) + (fVar190 - local_258);
  fVar132 = (fVar154 - fStack_250) + (fVar200 - fStack_254);
  fVar138 = (fVar181 - fStack_24c) + (fVar154 - fStack_250);
  fVar152 = (fVar181 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar182 = (fVar191 - fStack_144) + (fVar153 - local_148);
  fVar201 = (fVar183 - fStack_140) + (fVar191 - fStack_144);
  fVar202 = (fVar189 - fStack_13c) + (fVar183 - fStack_140);
  fVar214 = (fVar189 - fStack_13c) + 0.0;
  auVar193._0_8_ =
       CONCAT44(fStack_144 * fVar132 - fStack_254 * fVar201,
                local_148 * fVar118 - local_258 * fVar182);
  auVar193._8_4_ = fStack_140 * fVar138 - fStack_250 * fVar202;
  auVar193._12_4_ = fStack_13c * fVar152 - fStack_24c * fVar214;
  auVar142._0_4_ = fVar117 * fVar118 - local_238 * fVar182;
  auVar142._4_4_ = fVar130 * fVar132 - fStack_234 * fVar201;
  auVar142._8_4_ = fVar137 * fVar138 - fStack_230 * fVar202;
  auVar142._12_4_ = fVar139 * fVar152 - fStack_22c * fVar214;
  auVar172._0_8_ =
       CONCAT44((float)local_408._4_4_ * fVar132 - fVar201 * local_248._4_4_,
                (float)local_408._0_4_ * fVar118 - fVar182 * local_248._0_4_);
  auVar172._8_4_ = fStack_400 * fVar138 - fVar202 * local_248._8_4_;
  auVar172._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
  auVar252._0_4_ = fVar118 * fStack_144 - fVar182 * fStack_254;
  auVar252._4_4_ = fVar132 * fStack_140 - fVar201 * fStack_250;
  auVar252._8_4_ = fVar138 * fStack_13c - fVar202 * fStack_24c;
  auVar252._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
  auVar217._0_8_ =
       CONCAT44(fVar191 * fVar132 - fVar200 * fVar201,fVar153 * fVar118 - fVar190 * fVar182);
  auVar217._8_4_ = fVar183 * fVar138 - fVar154 * fVar202;
  auVar217._12_4_ = fVar189 * fVar152 - fVar181 * fVar214;
  auVar264._0_4_ = local_108 * fVar118 - local_138 * fVar182;
  auVar264._4_4_ = fStack_104 * fVar132 - fStack_134 * fVar201;
  auVar264._8_4_ = fStack_100 * fVar138 - fStack_130 * fVar202;
  auVar264._12_4_ = fStack_fc * fVar152 - fStack_12c * fVar214;
  auVar206._0_8_ =
       CONCAT44(local_128._4_4_ * fVar132 - fVar201 * local_d8._4_4_,
                local_128._0_4_ * fVar118 - fVar182 * local_d8._0_4_);
  auVar206._8_4_ = local_128._8_4_ * fVar138 - fVar202 * local_d8._8_4_;
  auVar206._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
  auVar84._0_4_ = fVar118 * fVar191 - fVar182 * fVar200;
  auVar84._4_4_ = fVar132 * fVar183 - fVar201 * fVar154;
  auVar84._8_4_ = fVar138 * fVar189 - fVar202 * fVar181;
  auVar84._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
  auVar106._8_4_ = auVar193._8_4_;
  auVar106._0_8_ = auVar193._0_8_;
  auVar106._12_4_ = auVar193._12_4_;
  auVar63 = minps(auVar106,auVar142);
  auVar104 = maxps(auVar193,auVar142);
  auVar143._8_4_ = auVar172._8_4_;
  auVar143._0_8_ = auVar172._0_8_;
  auVar143._12_4_ = auVar172._12_4_;
  auVar205 = minps(auVar143,auVar252);
  auVar63 = minps(auVar63,auVar205);
  auVar205 = maxps(auVar172,auVar252);
  auVar122 = maxps(auVar104,auVar205);
  auVar144._8_4_ = auVar217._8_4_;
  auVar144._0_8_ = auVar217._0_8_;
  auVar144._12_4_ = auVar217._12_4_;
  auVar205 = minps(auVar144,auVar264);
  auVar218 = maxps(auVar217,auVar264);
  auVar173._8_4_ = auVar206._8_4_;
  auVar173._0_8_ = auVar206._0_8_;
  auVar173._12_4_ = auVar206._12_4_;
  auVar104 = minps(auVar173,auVar84);
  auVar205 = minps(auVar205,auVar104);
  auVar63 = minps(auVar63,auVar205);
  auVar205 = maxps(auVar206,auVar84);
  auVar205 = maxps(auVar218,auVar205);
  auVar205 = maxps(auVar122,auVar205);
  bVar47 = auVar63._4_4_ <= fStack_154;
  bVar12 = auVar63._8_4_ <= fStack_150;
  bVar13 = auVar63._12_4_ <= fStack_14c;
  auVar39._4_4_ = -(uint)bVar12;
  auVar39._0_4_ = -(uint)bVar47;
  auVar39._8_4_ = -(uint)bVar13;
  auVar39._12_4_ = 0;
  auVar110 = auVar39 << 0x20;
  auVar194._0_4_ =
       -(uint)(local_168 <= auVar205._0_4_ && auVar63._0_4_ <= local_158) & local_178._0_4_;
  auVar194._4_4_ = -(uint)(fStack_164 <= auVar205._4_4_ && bVar47) & local_178._4_4_;
  auVar194._8_4_ = -(uint)(fStack_160 <= auVar205._8_4_ && bVar12) & local_178._8_4_;
  auVar194._12_4_ = -(uint)(fStack_15c <= auVar205._12_4_ && bVar13) & local_178._12_4_;
  uVar48 = movmskps((int)uVar42,auVar194);
  uVar42 = (ulong)uVar48;
  if (uVar48 != 0) {
    fVar118 = (fVar200 - fVar190) + (fStack_254 - local_258);
    fVar132 = (fVar154 - fVar200) + (fStack_250 - fStack_254);
    fVar138 = (fVar181 - fVar154) + (fStack_24c - fStack_250);
    fVar152 = (0.0 - fVar181) + (0.0 - fStack_24c);
    fVar182 = (fVar191 - fVar153) + (fStack_144 - local_148);
    fVar201 = (fVar183 - fVar191) + (fStack_140 - fStack_144);
    fVar202 = (fVar189 - fVar183) + (fStack_13c - fStack_140);
    fVar214 = (0.0 - fVar189) + (0.0 - fStack_13c);
    auVar267._0_8_ =
         CONCAT44(fStack_144 * fVar132 - fStack_254 * fVar201,
                  local_148 * fVar118 - local_258 * fVar182);
    auVar267._8_4_ = fStack_140 * fVar138 - fStack_250 * fVar202;
    auVar267._12_4_ = fStack_13c * fVar152 - fStack_24c * fVar214;
    auVar145._0_4_ = fVar117 * fVar118 - local_238 * fVar182;
    auVar145._4_4_ = fVar130 * fVar132 - fStack_234 * fVar201;
    auVar145._8_4_ = fVar137 * fVar138 - fStack_230 * fVar202;
    auVar145._12_4_ = fVar139 * fVar152 - fStack_22c * fVar214;
    auVar207._0_8_ =
         CONCAT44((float)local_408._4_4_ * fVar132 - local_248._4_4_ * fVar201,
                  (float)local_408._0_4_ * fVar118 - local_248._0_4_ * fVar182);
    auVar207._8_4_ = fStack_400 * fVar138 - local_248._8_4_ * fVar202;
    auVar207._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
    auVar174._0_4_ = fStack_144 * fVar118 - fStack_254 * fVar182;
    auVar174._4_4_ = fStack_140 * fVar132 - fStack_250 * fVar201;
    auVar174._8_4_ = fStack_13c * fVar138 - fStack_24c * fVar202;
    auVar174._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
    auVar127._0_8_ =
         CONCAT44(fVar191 * fVar132 - fVar200 * fVar201,fVar153 * fVar118 - fVar190 * fVar182);
    auVar127._8_4_ = fVar183 * fVar138 - fVar154 * fVar202;
    auVar127._12_4_ = fVar189 * fVar152 - fVar181 * fVar214;
    auVar228._0_4_ = local_108 * fVar118 - local_138 * fVar182;
    auVar228._4_4_ = fStack_104 * fVar132 - fStack_134 * fVar201;
    auVar228._8_4_ = fStack_100 * fVar138 - fStack_130 * fVar202;
    auVar228._12_4_ = fStack_fc * fVar152 - fStack_12c * fVar214;
    auVar253._0_8_ =
         CONCAT44(local_128._4_4_ * fVar132 - local_d8._4_4_ * fVar201,
                  local_128._0_4_ * fVar118 - local_d8._0_4_ * fVar182);
    auVar253._8_4_ = local_128._8_4_ * fVar138 - local_d8._8_4_ * fVar202;
    auVar253._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
    auVar84._0_4_ = fVar118 * fVar191 - fVar182 * fVar200;
    auVar84._4_4_ = fVar132 * fVar183 - fVar201 * fVar154;
    auVar84._8_4_ = fVar138 * fVar189 - fVar202 * fVar181;
    auVar84._12_4_ = fVar152 * 0.0 - fVar214 * 0.0;
    auVar107._8_4_ = auVar267._8_4_;
    auVar107._0_8_ = auVar267._0_8_;
    auVar107._12_4_ = auVar267._12_4_;
    auVar63 = minps(auVar107,auVar145);
    auVar104 = maxps(auVar267,auVar145);
    auVar146._8_4_ = auVar207._8_4_;
    auVar146._0_8_ = auVar207._0_8_;
    auVar146._12_4_ = auVar207._12_4_;
    auVar205 = minps(auVar146,auVar174);
    auVar63 = minps(auVar63,auVar205);
    auVar205 = maxps(auVar207,auVar174);
    auVar218 = maxps(auVar104,auVar205);
    auVar147._8_4_ = auVar127._8_4_;
    auVar147._0_8_ = auVar127._0_8_;
    auVar147._12_4_ = auVar127._12_4_;
    auVar104 = minps(auVar147,auVar228);
    auVar205 = maxps(auVar127,auVar228);
    auVar175._8_4_ = auVar253._8_4_;
    auVar175._0_8_ = auVar253._0_8_;
    auVar175._12_4_ = auVar253._12_4_;
    auVar122 = minps(auVar175,auVar84);
    auVar104 = minps(auVar104,auVar122);
    auVar63 = minps(auVar63,auVar104);
    auVar104 = maxps(auVar253,auVar84);
    auVar205 = maxps(auVar205,auVar104);
    auVar205 = maxps(auVar218,auVar205);
    bVar47 = auVar63._4_4_ <= fStack_154;
    bVar12 = auVar63._8_4_ <= fStack_150;
    bVar13 = auVar63._12_4_ <= fStack_14c;
    auVar40._4_4_ = -(uint)bVar12;
    auVar40._0_4_ = -(uint)bVar47;
    auVar40._8_4_ = -(uint)bVar13;
    auVar40._12_4_ = 0;
    auVar110 = auVar40 << 0x20;
    auVar268._0_4_ =
         -(uint)(local_168 <= auVar205._0_4_ && auVar63._0_4_ <= local_158) & auVar194._0_4_;
    auVar268._4_4_ = -(uint)(fStack_164 <= auVar205._4_4_ && bVar47) & auVar194._4_4_;
    auVar268._8_4_ = -(uint)(fStack_160 <= auVar205._8_4_ && bVar12) & auVar194._8_4_;
    auVar268._12_4_ = -(uint)(fStack_15c <= auVar205._12_4_ && bVar13) & auVar194._12_4_;
    uVar48 = movmskps(uVar48,auVar268);
    uVar42 = (ulong)uVar48;
    auVar264 = local_118;
    if (uVar48 != 0) {
      uVar42 = (ulong)(byte)uVar48;
      auStack_208[uVar46] = uVar48 & 0xff;
      *(ulong *)(afStack_78 + uVar46 * 2) = CONCAT44(fVar96,fVar95);
      auVar84._8_4_ = fVar97;
      auVar84._0_8_ = CONCAT44(fVar55,fVar131);
      auVar84._12_4_ = fVar116;
      *(ulong *)(afStack_58 + uVar46 * 2) = CONCAT44(fVar55,fVar131);
      uVar46 = (ulong)((int)uVar46 + 1);
    }
  }
LAB_0030d9a5:
  auVar63 = _local_408;
  if ((int)uVar46 == 0) {
    if (bVar45 != 0) goto LAB_0030ea71;
    fVar131 = ray->tfar;
    auVar115._4_4_ = -(uint)(fStack_184 <= fVar131);
    auVar115._0_4_ = -(uint)(local_188 <= fVar131);
    auVar115._8_4_ = -(uint)(fStack_180 <= fVar131);
    auVar115._12_4_ = -(uint)(fStack_17c <= fVar131);
    uVar48 = movmskps((int)uVar42,auVar115);
    uVar48 = (uint)uVar44 & uVar48;
    goto LAB_0030cad3;
  }
  uVar50 = (int)uVar46 - 1;
  uVar42 = (ulong)uVar50;
  uVar48 = auStack_208[uVar42];
  fVar131 = afStack_58[uVar42 * 2];
  fVar55 = afStack_58[uVar42 * 2 + 1];
  fVar97 = 0.0;
  fVar116 = 0.0;
  uVar11 = 0;
  if (uVar48 != 0) {
    for (; (uVar48 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
    }
  }
  uVar48 = uVar48 - 1 & uVar48;
  auStack_208[uVar42] = uVar48;
  if (uVar48 == 0) {
    uVar46 = (ulong)uVar50;
  }
  fVar96 = (float)(uVar11 + 1) * 0.33333334;
  fVar130 = auVar84._4_4_ * 0.0;
  fVar132 = auVar110._4_4_ * 0.0;
  fVar117 = afStack_78[uVar42 * 2];
  fVar118 = afStack_78[uVar42 * 2 + 1];
  fVar95 = fVar117 * (1.0 - (float)uVar11 * 0.33333334) + fVar118 * (float)uVar11 * 0.33333334;
  fVar96 = fVar117 * (1.0 - fVar96) + fVar118 * fVar96;
  fVar130 = fVar117 * (0.0 - fVar130) + fVar118 * fVar130;
  fVar118 = fVar117 * (0.0 - fVar132) + fVar118 * fVar132;
  fVar117 = fVar96 - fVar95;
  if (fVar117 < 0.16666667) {
    fVar191 = 1.0 - fVar131;
    fVar183 = 1.0 - fVar131;
    fVar200 = 1.0 - fVar55;
    fVar154 = 1.0 - fVar55;
    fVar138 = (float)local_2d8._0_4_ * fVar191 + local_328 * fVar131;
    fVar152 = (float)local_2d8._4_4_ * fVar183 + fStack_324 * fVar131;
    fVar97 = fStack_2d0 * fVar200 + fStack_320 * fVar55;
    fVar116 = fStack_2cc * fVar154 + fStack_31c * fVar55;
    fVar132 = (float)local_2e8._0_4_ * fVar191 + local_338._0_4_ * fVar131;
    fVar137 = (float)local_2e8._4_4_ * fVar183 + local_338._4_4_ * fVar131;
    fVar139 = fStack_2e0 * fVar200 + local_338._8_4_ * fVar55;
    fVar153 = fStack_2dc * fVar154 + local_338._12_4_ * fVar55;
    fVar201 = (float)local_2f8._0_4_ * fVar191 + local_318 * fVar131;
    fVar214 = (float)local_2f8._4_4_ * fVar183 + fStack_314 * fVar131;
    fVar216 = fStack_2f0 * fVar200 + fStack_310 * fVar55;
    fVar225 = fStack_2ec * fVar154 + fStack_30c * fVar55;
    fVar189 = (fVar191 * (float)local_308._0_4_ + fVar131 * local_348) - fVar201;
    fVar190 = (fVar183 * (float)local_308._4_4_ + fVar131 * fStack_344) - fVar214;
    fVar181 = (fVar200 * fStack_300 + fVar55 * fStack_340) - fVar216;
    fVar182 = (fVar154 * fStack_2fc + fVar55 * fStack_33c) - fVar225;
    fVar191 = fVar95 * (fVar201 - fVar132) + fVar132;
    fVar183 = fVar95 * (fVar214 - fVar137) + fVar137;
    fVar200 = fVar95 * (fVar216 - fVar139) + fVar139;
    fVar154 = fVar95 * (fVar225 - fVar153) + fVar153;
    fVar202 = (fVar201 - fVar132) * fVar96 + fVar132;
    fVar215 = (fVar214 - fVar137) * fVar96 + fVar137;
    fVar224 = (fVar216 - fVar139) * fVar96 + fVar139;
    fVar226 = (fVar225 - fVar153) * fVar96 + fVar153;
    fVar233 = fVar95 * (fVar132 - fVar138) + fVar138;
    fVar235 = fVar95 * (fVar137 - fVar152) + fVar152;
    fVar238 = fVar95 * (fVar139 - fVar97) + fVar97;
    fVar245 = fVar95 * (fVar153 - fVar116) + fVar116;
    fVar233 = (fVar191 - fVar233) * fVar95 + fVar233;
    fVar235 = (fVar183 - fVar235) * fVar95 + fVar235;
    fVar238 = (fVar200 - fVar238) * fVar95 + fVar238;
    fVar245 = (fVar154 - fVar245) * fVar95 + fVar245;
    fVar191 = (((fVar95 * fVar189 + fVar201) - fVar191) * fVar95 + fVar191) - fVar233;
    fVar183 = (((fVar95 * fVar190 + fVar214) - fVar183) * fVar95 + fVar183) - fVar235;
    fVar200 = (((fVar95 * fVar181 + fVar216) - fVar200) * fVar95 + fVar200) - fVar238;
    fVar154 = (((fVar95 * fVar182 + fVar225) - fVar154) * fVar95 + fVar154) - fVar245;
    auVar128._0_4_ = fVar95 * fVar191 + fVar233;
    auVar128._4_4_ = fVar95 * fVar183 + fVar235;
    auVar128._8_4_ = fVar95 * fVar200 + fVar238;
    auVar128._12_4_ = fVar95 * fVar154 + fVar245;
    fVar138 = (fVar132 - fVar138) * fVar96 + fVar138;
    fVar152 = (fVar137 - fVar152) * fVar96 + fVar152;
    fVar97 = (fVar139 - fVar97) * fVar96 + fVar97;
    fVar116 = (fVar153 - fVar116) * fVar96 + fVar116;
    fVar138 = (fVar202 - fVar138) * fVar96 + fVar138;
    fVar152 = (fVar215 - fVar152) * fVar96 + fVar152;
    fVar97 = (fVar224 - fVar97) * fVar96 + fVar97;
    fVar116 = (fVar226 - fVar116) * fVar96 + fVar116;
    fVar132 = (((fVar189 * fVar96 + fVar201) - fVar202) * fVar96 + fVar202) - fVar138;
    fVar137 = (((fVar190 * fVar96 + fVar214) - fVar215) * fVar96 + fVar215) - fVar152;
    fVar139 = (((fVar181 * fVar96 + fVar216) - fVar224) * fVar96 + fVar224) - fVar97;
    fVar153 = (((fVar182 * fVar96 + fVar225) - fVar226) * fVar96 + fVar226) - fVar116;
    fVar138 = fVar96 * fVar132 + fVar138;
    fVar152 = fVar96 * fVar137 + fVar152;
    fVar95 = fVar96 * fVar139 + fVar97;
    fVar96 = fVar96 * fVar153 + fVar116;
    fVar97 = fVar117 * 0.33333334;
    fVar189 = fVar191 * (float)DAT_01f4afa0 * fVar97 + auVar128._0_4_;
    fVar190 = fVar183 * DAT_01f4afa0._4_4_ * fVar97 + auVar128._4_4_;
    fVar200 = fVar200 * DAT_01f4afa0._8_4_ * fVar97 + auVar128._8_4_;
    fVar154 = fVar154 * DAT_01f4afa0._12_4_ * fVar97 + auVar128._12_4_;
    fVar181 = fVar138 - fVar97 * fVar132 * (float)DAT_01f4afa0;
    fVar182 = fVar152 - fVar97 * fVar137 * DAT_01f4afa0._4_4_;
    fVar201 = fVar95 - fVar97 * fVar139 * DAT_01f4afa0._8_4_;
    fVar202 = fVar96 - fVar97 * fVar153 * DAT_01f4afa0._12_4_;
    auVar16._4_8_ = auVar264._8_8_;
    auVar16._0_4_ = auVar128._4_4_;
    auVar262._0_8_ = auVar16._0_8_ << 0x20;
    auVar262._8_4_ = auVar128._8_4_;
    auVar262._12_4_ = auVar128._12_4_;
    local_3b8._8_8_ = auVar128._8_8_;
    local_3b8._0_8_ = auVar262._8_8_;
    auVar17._4_8_ = DAT_01f4afa0._8_8_;
    auVar17._0_4_ = fVar152;
    auVar208._0_8_ = auVar17._0_8_ << 0x20;
    auVar208._8_4_ = fVar95;
    auVar208._12_4_ = fVar96;
    fVar139 = (fVar95 - fVar138) + (auVar128._8_4_ - auVar128._0_4_);
    fVar153 = (fVar96 - fVar152) + (auVar128._12_4_ - auVar128._4_4_);
    auVar219._0_4_ = fVar182 * fVar153;
    auVar219._4_4_ = fVar182 * fVar153;
    auVar219._8_4_ = fVar202 * fVar153;
    auVar219._12_4_ = fVar202 * fVar153;
    fVar97 = auVar128._0_4_ * fVar139 + auVar128._4_4_ * fVar153;
    fVar116 = auVar128._8_4_ * fVar139 + auVar128._12_4_ * fVar153;
    fVar191 = fVar189 * fVar139 + fVar190 * fVar153;
    fVar183 = fVar200 * fVar139 + fVar154 * fVar153;
    fVar214 = fVar181 * fVar139 + auVar219._0_4_;
    auVar195._0_8_ = CONCAT44(fVar182 * fVar139 + auVar219._4_4_,fVar214);
    auVar195._8_4_ = fVar201 * fVar139 + auVar219._8_4_;
    auVar195._12_4_ = fVar202 * fVar139 + auVar219._12_4_;
    fVar137 = fVar139 * fVar138 + fVar153 * fVar152;
    fVar215 = fVar139 * fVar95 + fVar153 * fVar96;
    auVar18._4_8_ = auVar219._8_8_;
    auVar18._0_4_ = fVar190 * fVar139 + fVar190 * fVar153;
    auVar220._0_8_ = auVar18._0_8_ << 0x20;
    auVar220._8_4_ = fVar183;
    auVar220._12_4_ = fVar154 * fVar139 + fVar154 * fVar153;
    fVar132 = fVar191;
    if (fVar191 <= fVar97) {
      fVar132 = fVar97;
      fVar97 = fVar191;
    }
    auVar221._8_8_ = auVar220._8_8_;
    auVar221._0_8_ = auVar221._8_8_;
    auVar82._8_4_ = auVar195._8_4_;
    auVar82._0_8_ = auVar195._0_8_;
    auVar82._12_4_ = auVar195._12_4_;
    if (fVar137 <= fVar214) {
      auVar82._0_4_ = fVar137;
    }
    if (auVar82._0_4_ <= fVar97) {
      fVar97 = auVar82._0_4_;
    }
    auVar19._4_8_ = auVar82._8_8_;
    auVar19._0_4_ = fVar139 * fVar152 + fVar153 * fVar152;
    auVar83._0_8_ = auVar19._0_8_ << 0x20;
    auVar83._8_4_ = fVar215;
    auVar83._12_4_ = fVar139 * fVar96 + fVar153 * fVar96;
    if (fVar137 <= fVar214) {
      fVar137 = fVar214;
    }
    auVar84._8_8_ = auVar83._8_8_;
    auVar84._0_8_ = auVar84._8_8_;
    if (fVar137 <= fVar132) {
      fVar137 = fVar132;
    }
    if (fVar183 <= fVar116) {
      auVar221._0_4_ = fVar116;
      fVar116 = fVar183;
    }
    auVar108._8_4_ = auVar195._8_4_;
    auVar108._0_8_ = auVar195._8_8_;
    auVar108._12_4_ = auVar195._12_4_;
    if (fVar215 <= auVar195._8_4_) {
      auVar108._0_4_ = fVar215;
    }
    if (auVar108._0_4_ <= fVar116) {
      fVar116 = auVar108._0_4_;
    }
    if (fVar215 <= auVar195._8_4_) {
      auVar84._0_4_ = auVar195._8_4_;
    }
    if (auVar84._0_4_ <= auVar221._0_4_) {
      auVar84._0_4_ = auVar221._0_4_;
    }
    bVar47 = 3 < (uint)uVar46;
    uVar20 = (undefined3)(uVar50 >> 8);
    uVar42 = (ulong)CONCAT31(uVar20,bVar47);
    fVar132 = auVar84._0_4_;
    if ((0.0001 <= fVar97) || (fVar132 <= -0.0001)) goto LAB_0030dcc2;
    goto LAB_0030dd0c;
  }
  goto LAB_0030d34b;
LAB_0030dcc2:
  auVar110._0_12_ = ZEXT812(0x38d1b717);
  auVar110._12_4_ = 0.0;
  if ((0.0001 <= fVar116 || fVar137 <= -0.0001) &&
     ((0.0001 <= fVar97 || fVar137 <= -0.0001 &&
      (auVar264 = local_3b8, 0.0001 <= fVar116 || fVar132 <= -0.0001)))) goto LAB_0030d9a5;
LAB_0030dd0c:
  local_408 = (undefined1  [8])auVar208._8_8_;
  bVar47 = bVar47 || fVar117 < 0.001;
  uVar42 = (ulong)CONCAT31(uVar20,bVar47);
  fVar153 = (float)(~-(uint)(fVar97 < 0.0) & 0x3f800000 | -(uint)(fVar97 < 0.0) & 0xbf800000);
  fVar191 = (float)(~-(uint)(fVar137 < 0.0) & 0x3f800000 | -(uint)(fVar137 < 0.0) & 0xbf800000);
  fVar139 = 0.0;
  if ((fVar153 == fVar191) && (!NAN(fVar153) && !NAN(fVar191))) {
    fVar139 = INFINITY;
  }
  fVar183 = 0.0;
  if ((fVar153 == fVar191) && (!NAN(fVar153) && !NAN(fVar191))) {
    fVar183 = -INFINITY;
  }
  fVar214 = (float)(~-(uint)(fVar116 < 0.0) & 0x3f800000 | -(uint)(fVar116 < 0.0) & 0xbf800000);
  if ((fVar153 != fVar214) || (fVar215 = fVar183, NAN(fVar153) || NAN(fVar214))) {
    if ((fVar116 != fVar97) || (NAN(fVar116) || NAN(fVar97))) {
      fVar116 = -fVar97 / (fVar116 - fVar97);
      fVar116 = (1.0 - fVar116) * 0.0 + fVar116;
      fVar215 = fVar116;
    }
    else {
      fVar116 = 0.0;
      if ((fVar97 != 0.0) || (fVar215 = 1.0, NAN(fVar97))) {
        fVar116 = INFINITY;
        fVar215 = -INFINITY;
      }
    }
    if (fVar116 <= fVar139) {
      fVar139 = fVar116;
    }
    if (fVar215 <= fVar183) {
      fVar215 = fVar183;
    }
  }
  fVar97 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar132 < 0.0) * 4);
  if ((fVar191 != fVar97) || (fVar116 = fVar215, NAN(fVar191) || NAN(fVar97))) {
    if ((fVar132 != fVar137) || (NAN(fVar132) || NAN(fVar137))) {
      fVar153 = -fVar137 / (fVar132 - fVar137);
      fVar153 = (1.0 - fVar153) * 0.0 + fVar153;
      fVar116 = fVar153;
    }
    else {
      fVar153 = 0.0;
      if ((fVar137 != 0.0) || (fVar116 = 1.0, NAN(fVar137))) {
        fVar153 = INFINITY;
        fVar116 = -INFINITY;
      }
    }
    if (fVar153 <= fVar139) {
      fVar139 = fVar153;
    }
    if (fVar116 <= fVar215) {
      fVar116 = fVar215;
    }
  }
  if ((fVar214 != fVar97) || (NAN(fVar214) || NAN(fVar97))) {
    fVar139 = (float)(~-(uint)(fVar139 < 1.0) & 0x3f800000 | (uint)fVar139 & -(uint)(fVar139 < 1.0))
    ;
    fVar116 = (float)(~-(uint)(fVar116 < 1.0) & (uint)fVar116 | -(uint)(fVar116 < 1.0) & 0x3f800000)
    ;
  }
  auVar109._0_8_ =
       CONCAT44(~-(uint)(fVar116 < 1.0),~-(uint)(fVar139 < 0.0) & (uint)fVar139) &
       0x3f800000ffffffff;
  auVar109._8_8_ = 0;
  auVar110 = auVar109 | ZEXT416((uint)fVar116 & -(uint)(fVar116 < 1.0)) << 0x20;
  fVar97 = auVar110._4_4_;
  auVar84._4_4_ = fVar97;
  auVar84._0_4_ = fVar97;
  auVar84._8_4_ = fVar97;
  auVar84._12_4_ = fVar97;
  auVar264 = _local_408;
  if (fVar97 < auVar110._0_4_) goto LAB_0030d9a5;
  fVar137 = auVar110._0_4_ + -0.1;
  fVar116 = auVar110._8_4_ + 0.0;
  fVar153 = auVar110._12_4_ + 0.0;
  uVar48 = -(uint)(fVar97 + 0.1 < 1.0);
  fVar137 = (float)(~-(uint)(fVar137 < 0.0) & (uint)fVar137);
  fVar139 = (float)(~uVar48 & 0x3f800000 | (uint)(fVar97 + 0.1) & uVar48);
  fVar97 = 1.0 - fVar137;
  fVar225 = 1.0 - fVar137;
  fVar226 = 1.0 - fVar139;
  fVar233 = 1.0 - fVar139;
  fVar191 = auVar128._0_4_ * fVar97 + auVar128._8_4_ * fVar137;
  fVar183 = auVar128._4_4_ * fVar225 + auVar128._12_4_ * fVar137;
  fVar214 = auVar128._0_4_ * fVar226 + auVar128._8_4_ * fVar139;
  fVar215 = auVar128._4_4_ * fVar233 + auVar128._12_4_ * fVar139;
  fVar216 = fVar189 * fVar97 + fVar200 * fVar137;
  fVar224 = fVar190 * fVar225 + fVar154 * fVar137;
  fVar189 = fVar189 * fVar226 + fVar200 * fVar139;
  fVar190 = fVar190 * fVar233 + fVar154 * fVar139;
  fVar200 = fVar181 * fVar97 + fVar201 * fVar137;
  fVar154 = fVar182 * fVar225 + fVar202 * fVar137;
  fVar181 = fVar181 * fVar226 + fVar201 * fVar139;
  fVar182 = fVar182 * fVar233 + fVar202 * fVar139;
  fVar201 = fVar97 * fVar138 + fVar95 * fVar137;
  fVar202 = fVar225 * fVar152 + fVar96 * fVar137;
  fVar225 = fVar226 * fVar138 + auVar63._8_4_ * fVar139;
  fVar226 = fVar233 * fVar152 + auVar63._12_4_ * fVar139;
  fVar138 = fVar55 * fVar116;
  fVar152 = fVar55 * fVar153;
  fVar233 = fVar131 * (1.0 - fVar139);
  fVar97 = fVar131 * (0.0 - fVar116);
  fVar116 = fVar131 * (0.0 - fVar153);
  fVar131 = fVar131 * (1.0 - fVar137) + fVar55 * fVar137;
  fVar55 = fVar233 + fVar55 * fVar139;
  fVar97 = fVar97 + fVar138;
  fVar116 = fVar116 + fVar152;
  fVar117 = 1.0 / fVar117;
  auVar111._0_4_ = fVar225 - fVar201;
  auVar111._4_4_ = fVar226 - fVar202;
  auVar111._8_4_ = fVar225 - fVar225;
  auVar111._12_4_ = fVar226 - fVar226;
  auVar135._0_8_ = CONCAT44(fVar182 - fVar154,fVar181 - fVar200);
  auVar135._8_4_ = fVar181 - fVar181;
  auVar135._12_4_ = fVar182 - fVar182;
  auVar176._0_4_ = fVar189 - fVar216;
  auVar176._4_4_ = fVar190 - fVar224;
  auVar176._8_4_ = fVar189 - fVar189;
  auVar176._12_4_ = fVar190 - fVar190;
  auVar222._0_8_ = CONCAT44((fVar224 - fVar183) * 3.0,(fVar216 - fVar191) * 3.0);
  auVar222._8_4_ = (fVar189 - fVar214) * 3.0;
  auVar222._12_4_ = (fVar190 - fVar215) * 3.0;
  auVar148._0_8_ = CONCAT44((fVar154 - fVar224) * 3.0,(fVar200 - fVar216) * 3.0);
  auVar148._8_4_ = (fVar181 - fVar189) * 3.0;
  auVar148._12_4_ = (fVar182 - fVar190) * 3.0;
  auVar241._0_4_ = (fVar201 - fVar200) * 3.0;
  auVar241._4_4_ = (fVar202 - fVar154) * 3.0;
  auVar241._8_4_ = (fVar225 - fVar181) * 3.0;
  auVar241._12_4_ = (fVar226 - fVar182) * 3.0;
  auVar196._8_4_ = auVar148._8_4_;
  auVar196._0_8_ = auVar148._0_8_;
  auVar196._12_4_ = auVar148._12_4_;
  auVar205 = minps(auVar196,auVar241);
  auVar63 = maxps(auVar148,auVar241);
  auVar229._8_4_ = auVar222._8_4_;
  auVar229._0_8_ = auVar222._0_8_;
  auVar229._12_4_ = auVar222._12_4_;
  auVar122 = minps(auVar229,auVar205);
  auVar104 = maxps(auVar222,auVar63);
  auVar21._4_8_ = auVar63._8_8_;
  auVar21._0_4_ = auVar122._4_4_;
  auVar149._0_8_ = auVar21._0_8_ << 0x20;
  auVar149._8_4_ = auVar122._8_4_;
  auVar149._12_4_ = auVar122._12_4_;
  auVar150._8_8_ = auVar122._8_8_;
  auVar150._0_8_ = auVar149._8_8_;
  auVar22._4_8_ = auVar205._8_8_;
  auVar22._0_4_ = auVar104._4_4_;
  auVar197._0_8_ = auVar22._0_8_ << 0x20;
  auVar197._8_4_ = auVar104._8_4_;
  auVar197._12_4_ = auVar104._12_4_;
  auVar198._8_8_ = auVar104._8_8_;
  auVar198._0_8_ = auVar197._8_8_;
  auVar205 = minps(auVar122,auVar150);
  auVar63 = maxps(auVar104,auVar198);
  fVar233 = auVar205._0_4_ * fVar117;
  fVar235 = auVar205._4_4_ * fVar117;
  fVar238 = auVar205._8_4_ * fVar117;
  fVar245 = auVar205._12_4_ * fVar117;
  fVar181 = fVar117 * auVar63._0_4_;
  fVar182 = fVar117 * auVar63._4_4_;
  fVar202 = fVar117 * auVar63._8_4_;
  fVar117 = fVar117 * auVar63._12_4_;
  fVar225 = 1.0 / (fVar55 - fVar131);
  auVar85._0_8_ = CONCAT44(fVar215 - fVar183,fVar214 - fVar191);
  auVar85._8_4_ = fVar214 - fVar214;
  auVar85._12_4_ = fVar215 - fVar215;
  auVar209._8_4_ = auVar85._8_4_;
  auVar209._0_8_ = auVar85._0_8_;
  auVar209._12_4_ = auVar85._12_4_;
  auVar104 = minps(auVar209,auVar176);
  auVar63 = maxps(auVar85,auVar176);
  auVar129._8_4_ = auVar135._8_4_;
  auVar129._0_8_ = auVar135._0_8_;
  auVar129._12_4_ = auVar135._12_4_;
  auVar205 = minps(auVar129,auVar111);
  auVar104 = minps(auVar104,auVar205);
  auVar205 = maxps(auVar135,auVar111);
  auVar63 = maxps(auVar63,auVar205);
  fVar216 = auVar104._0_4_ * fVar225;
  fVar224 = auVar104._4_4_ * fVar225;
  fVar226 = fVar225 * auVar63._0_4_;
  fVar225 = fVar225 * auVar63._4_4_;
  local_408._4_4_ = fVar131;
  local_408._0_4_ = fVar95;
  fStack_400 = fVar96;
  fStack_3fc = fVar55;
  auVar199._4_4_ = fVar55;
  auVar199._0_4_ = fVar96;
  auVar199._8_4_ = fVar130;
  auVar199._12_4_ = fVar118;
  local_1ec = (fVar95 + fVar96) * 0.5;
  fVar190 = (fVar131 + fVar55) * 0.5;
  fVar200 = (fVar96 + fVar130) * 0.0;
  fVar154 = (fVar55 + fVar118) * 0.0;
  fVar137 = local_88 * local_1ec + (float)local_2a8;
  fVar138 = fStack_84 * local_1ec + local_2a8._4_4_;
  fVar139 = fStack_80 * local_1ec + fStack_2a0;
  fVar152 = fStack_7c * local_1ec + fStack_29c;
  fVar153 = local_98 * local_1ec + local_2b8;
  fVar191 = fStack_94 * local_1ec + fStack_2b4;
  fVar183 = fStack_90 * local_1ec + (float)uStack_2b0;
  fVar189 = fStack_8c * local_1ec + uStack_2b0._4_4_;
  fVar137 = (fVar153 - fVar137) * local_1ec + fVar137;
  fVar138 = (fVar191 - fVar138) * local_1ec + fVar138;
  fVar139 = (fVar183 - fVar139) * local_1ec + fVar139;
  fVar152 = (fVar189 - fVar152) * local_1ec + fVar152;
  fVar153 = (((local_a8 * local_1ec + (float)local_2c8) - fVar153) * local_1ec + fVar153) - fVar137;
  fVar191 = (((fStack_a4 * local_1ec + local_2c8._4_4_) - fVar191) * local_1ec + fVar191) - fVar138;
  fVar183 = (((fStack_a0 * local_1ec + fStack_2c0) - fVar183) * local_1ec + fVar183) - fVar139;
  fVar189 = (((fStack_9c * local_1ec + fStack_2bc) - fVar189) * local_1ec + fVar189) - fVar152;
  fVar137 = local_1ec * fVar153 + fVar137;
  fVar138 = local_1ec * fVar191 + fVar138;
  fVar153 = fVar153 * 3.0;
  fVar191 = fVar191 * 3.0;
  fVar139 = (local_1ec * fVar183 + fVar139) - fVar137;
  fVar152 = (local_1ec * fVar189 + fVar152) - fVar138;
  fVar153 = (fVar183 * 3.0 - fVar153) * fVar190 + fVar153;
  fVar191 = (fVar189 * 3.0 - fVar191) * fVar190 + fVar191;
  auVar136._0_8_ = CONCAT44(fVar153,fVar139) ^ 0x80000000;
  auVar136._8_4_ = fVar153;
  auVar136._12_4_ = fVar153;
  fVar246 = fVar95 - local_1ec;
  fVar247 = fVar131 - fVar190;
  fVar248 = fVar96 - fVar200;
  fVar255 = fVar55 - fVar154;
  fVar257 = fVar96 - local_1ec;
  fVar259 = fVar55 - fVar190;
  fVar130 = fVar130 - fVar200;
  fVar118 = fVar118 - fVar154;
  fVar137 = fVar139 * fVar190 + fVar137;
  fVar138 = fVar152 * fVar190 + fVar138;
  auVar151._0_8_ = CONCAT44(fVar191,fVar152) ^ 0x8000000000000000;
  auVar151._8_4_ = -fVar191;
  auVar151._12_4_ = -fVar191;
  auVar86._0_4_ = fVar152 * fVar153 - fVar191 * fVar139;
  auVar86._4_4_ = auVar86._0_4_;
  auVar86._8_4_ = auVar86._0_4_;
  auVar86._12_4_ = auVar86._0_4_;
  auVar205 = divps(auVar151,auVar86);
  auVar63 = divps(auVar136,auVar86);
  fVar189 = auVar205._0_4_;
  fVar200 = auVar205._4_4_;
  fVar191 = auVar63._0_4_;
  fVar183 = auVar63._4_4_;
  local_1ec = local_1ec - (fVar138 * fVar191 + fVar137 * fVar189);
  fStack_1e8 = fVar190 - (fVar138 * fVar183 + fVar137 * fVar200);
  fVar153 = fVar190 - (fVar138 * auVar63._8_4_ + fVar137 * auVar205._8_4_);
  fVar190 = fVar190 - (fVar138 * auVar63._12_4_ + fVar137 * auVar205._12_4_);
  auVar112._0_8_ = CONCAT44(fVar200 * fVar216,fVar200 * fVar233);
  auVar112._8_4_ = fVar200 * fVar235;
  auVar112._12_4_ = fVar200 * fVar224;
  auVar87._0_4_ = fVar200 * fVar181;
  auVar87._4_4_ = fVar200 * fVar226;
  auVar87._8_4_ = fVar200 * fVar182;
  auVar87._12_4_ = fVar200 * fVar225;
  auVar270._8_4_ = auVar112._8_4_;
  auVar270._0_8_ = auVar112._0_8_;
  auVar270._12_4_ = auVar112._12_4_;
  auVar122 = minps(auVar270,auVar87);
  auVar63 = maxps(auVar87,auVar112);
  auVar177._0_8_ = CONCAT44(fVar183 * fVar224,fVar183 * fVar235);
  auVar177._8_4_ = fVar183 * fVar238;
  auVar177._12_4_ = fVar183 * fVar245;
  auVar113._0_4_ = fVar183 * fVar182;
  auVar113._4_4_ = fVar183 * fVar225;
  auVar113._8_4_ = fVar183 * fVar202;
  auVar113._12_4_ = fVar183 * fVar117;
  auVar230._8_4_ = auVar177._8_4_;
  auVar230._0_8_ = auVar177._0_8_;
  auVar230._12_4_ = auVar177._12_4_;
  auVar104 = minps(auVar230,auVar113);
  auVar205 = maxps(auVar113,auVar177);
  fVar137 = 0.0 - (auVar205._0_4_ + auVar63._0_4_);
  fVar138 = 1.0 - (auVar205._4_4_ + auVar63._4_4_);
  fVar139 = 0.0 - (auVar205._8_4_ + auVar63._8_4_);
  fVar152 = 0.0 - (auVar205._12_4_ + auVar63._12_4_);
  fVar154 = 0.0 - (auVar104._0_4_ + auVar122._0_4_);
  fVar201 = 1.0 - (auVar104._4_4_ + auVar122._4_4_);
  fVar214 = 0.0 - (auVar104._8_4_ + auVar122._8_4_);
  fVar215 = 0.0 - (auVar104._12_4_ + auVar122._12_4_);
  auVar114._0_8_ = CONCAT44(fVar247 * fVar138,fVar246 * fVar137);
  auVar114._8_4_ = fVar248 * fVar139;
  auVar114._12_4_ = fVar255 * fVar152;
  auVar242._0_8_ = CONCAT44(fVar216 * fVar189,fVar233 * fVar189);
  auVar242._8_4_ = fVar235 * fVar189;
  auVar242._12_4_ = fVar224 * fVar189;
  auVar178._0_4_ = fVar189 * fVar181;
  auVar178._4_4_ = fVar189 * fVar226;
  auVar178._8_4_ = fVar189 * fVar182;
  auVar178._12_4_ = fVar189 * fVar225;
  auVar231._8_4_ = auVar242._8_4_;
  auVar231._0_8_ = auVar242._0_8_;
  auVar231._12_4_ = auVar242._12_4_;
  auVar205 = minps(auVar231,auVar178);
  auVar63 = maxps(auVar178,auVar242);
  auVar210._0_8_ = CONCAT44(fVar224 * fVar191,fVar235 * fVar191);
  auVar210._8_4_ = fVar238 * fVar191;
  auVar210._12_4_ = fVar245 * fVar191;
  auVar243._0_4_ = fVar191 * fVar182;
  auVar243._4_4_ = fVar191 * fVar225;
  auVar243._8_4_ = fVar191 * fVar202;
  auVar243._12_4_ = fVar191 * fVar117;
  auVar269._8_4_ = auVar210._8_4_;
  auVar269._0_8_ = auVar210._0_8_;
  auVar269._12_4_ = auVar210._12_4_;
  auVar122 = minps(auVar269,auVar243);
  auVar232._0_4_ = fVar246 * fVar154;
  auVar232._4_4_ = fVar247 * fVar201;
  auVar232._8_4_ = fVar248 * fVar214;
  auVar232._12_4_ = fVar255 * fVar215;
  auVar88._0_8_ = CONCAT44(fVar138 * fVar259,fVar137 * fVar257);
  auVar88._8_4_ = fVar139 * fVar130;
  auVar88._12_4_ = fVar152 * fVar118;
  auVar188._0_4_ = fVar154 * fVar257;
  auVar188._4_4_ = fVar201 * fVar259;
  auVar188._8_4_ = fVar214 * fVar130;
  auVar188._12_4_ = fVar215 * fVar118;
  auVar104 = maxps(auVar243,auVar210);
  fVar117 = 1.0 - (auVar104._0_4_ + auVar63._0_4_);
  fVar137 = 0.0 - (auVar104._4_4_ + auVar63._4_4_);
  fVar138 = 0.0 - (auVar104._8_4_ + auVar63._8_4_);
  fVar139 = 0.0 - (auVar104._12_4_ + auVar63._12_4_);
  fVar152 = 1.0 - (auVar122._0_4_ + auVar205._0_4_);
  fVar154 = 0.0 - (auVar122._4_4_ + auVar205._4_4_);
  fVar181 = 0.0 - (auVar122._8_4_ + auVar205._8_4_);
  fVar182 = 0.0 - (auVar122._12_4_ + auVar205._12_4_);
  auVar211._0_8_ = CONCAT44(fVar247 * fVar137,fVar246 * fVar117);
  auVar211._8_4_ = fVar248 * fVar138;
  auVar211._12_4_ = fVar255 * fVar139;
  auVar254._0_4_ = fVar246 * fVar152;
  auVar254._4_4_ = fVar247 * fVar154;
  auVar254._8_4_ = fVar248 * fVar181;
  auVar254._12_4_ = fVar255 * fVar182;
  auVar179._0_8_ = CONCAT44(fVar137 * fVar259,fVar117 * fVar257);
  auVar179._8_4_ = fVar138 * fVar130;
  auVar179._12_4_ = fVar139 * fVar118;
  auVar223._0_4_ = fVar152 * fVar257;
  auVar223._4_4_ = fVar154 * fVar259;
  auVar223._8_4_ = fVar181 * fVar130;
  auVar223._12_4_ = fVar182 * fVar118;
  auVar244._8_4_ = auVar211._8_4_;
  auVar244._0_8_ = auVar211._0_8_;
  auVar244._12_4_ = auVar211._12_4_;
  auVar63 = minps(auVar244,auVar254);
  auVar263._8_4_ = auVar179._8_4_;
  auVar263._0_8_ = auVar179._0_8_;
  auVar263._12_4_ = auVar179._12_4_;
  auVar264 = minps(auVar263,auVar223);
  auVar218 = minps(auVar63,auVar264);
  auVar205 = maxps(auVar254,auVar211);
  auVar63 = maxps(auVar223,auVar179);
  auVar104 = maxps(auVar63,auVar205);
  auVar212._8_4_ = auVar114._8_4_;
  auVar212._0_8_ = auVar114._0_8_;
  auVar212._12_4_ = auVar114._12_4_;
  auVar205 = minps(auVar212,auVar232);
  auVar180._8_4_ = auVar88._8_4_;
  auVar180._0_8_ = auVar88._0_8_;
  auVar180._12_4_ = auVar88._12_4_;
  auVar63 = minps(auVar180,auVar188);
  auVar205 = minps(auVar205,auVar63);
  auVar122 = maxps(auVar232,auVar114);
  auVar63 = maxps(auVar188,auVar88);
  auVar63 = maxps(auVar63,auVar122);
  auVar213._0_4_ = auVar218._4_4_ + auVar218._0_4_ + local_1ec;
  auVar213._4_4_ = auVar205._4_4_ + auVar205._0_4_ + fStack_1e8;
  auVar213._8_4_ = auVar218._8_4_ + auVar218._4_4_ + fVar153;
  auVar213._12_4_ = auVar218._12_4_ + auVar205._4_4_ + fVar190;
  fVar117 = auVar104._4_4_ + auVar104._0_4_ + local_1ec;
  fVar118 = auVar63._4_4_ + auVar63._0_4_ + fStack_1e8;
  auVar89._4_4_ = fVar118;
  auVar89._0_4_ = fVar117;
  auVar110 = maxps(_local_408,auVar213);
  auVar89._8_4_ = auVar104._8_4_ + auVar104._4_4_ + fVar153;
  auVar89._12_4_ = auVar104._12_4_ + auVar63._4_4_ + fVar190;
  auVar63 = minps(auVar89,auVar199);
  iVar49 = -(uint)(auVar63._0_4_ < auVar110._0_4_);
  iVar51 = -(uint)(auVar63._4_4_ < auVar110._4_4_);
  auVar90._4_4_ = iVar51;
  auVar90._0_4_ = iVar49;
  auVar90._8_4_ = iVar51;
  auVar90._12_4_ = iVar51;
  auVar84._8_8_ = auVar90._8_8_;
  auVar84._4_4_ = (float)iVar49;
  auVar84._0_4_ = (float)iVar49;
  iVar49 = movmskpd((uint)(fVar132 < 0.0),auVar84);
  if (iVar49 != 0) goto LAB_0030d9a5;
  bVar41 = 0;
  if ((fVar95 < auVar213._0_4_) && (fVar117 < fVar96)) {
    bVar41 = -(fVar118 < fVar55) & fVar131 < auVar213._4_4_;
  }
  bVar41 = bVar47 | bVar41;
  uVar42 = (ulong)CONCAT31(uVar20,bVar41);
  if (bVar41 != 1) goto LAB_0030d34b;
  uVar42 = 0xc9;
  do {
    uVar42 = uVar42 - 1;
    auVar264 = local_b8;
    if (uVar42 == 0) goto LAB_0030d9a5;
    fVar55 = 1.0 - local_1ec;
    fVar116 = local_1ec * local_1ec * local_1ec;
    fVar97 = local_1ec * local_1ec * 3.0 * fVar55;
    fVar131 = fVar55 * fVar55 * fVar55;
    fVar117 = local_1ec * 3.0 * fVar55 * fVar55;
    fVar55 = fVar131 * (float)local_2a8 +
             fVar117 * local_2b8 + fVar97 * (float)local_2c8 + fVar116 * local_b8._0_4_;
    fVar95 = fVar131 * local_2a8._4_4_ +
             fVar117 * fStack_2b4 + fVar97 * local_2c8._4_4_ + fVar116 * local_b8._4_4_;
    fVar96 = fVar131 * fStack_2a0 +
             fVar117 * (float)uStack_2b0 + fVar97 * fStack_2c0 + fVar116 * local_b8._8_4_;
    fVar97 = fVar131 * fStack_29c +
             fVar117 * uStack_2b0._4_4_ + fVar97 * fStack_2bc + fVar116 * local_b8._12_4_;
    fVar116 = (fVar96 - fVar55) * fStack_1e8;
    fVar117 = (fVar97 - fVar95) * fStack_1e8;
    fVar131 = (fVar96 - fVar55) * fStack_1e8 + fVar55;
    fVar96 = (fVar97 - fVar95) * fStack_1e8 + fVar95;
    local_1ec = local_1ec - (fVar96 * fVar191 + fVar131 * fVar189);
    fStack_1e8 = fStack_1e8 - (fVar96 * fVar183 + fVar131 * fVar200);
    fVar97 = ABS(fVar96);
    auVar84._0_8_ = CONCAT44(fVar96,fVar131) & 0x7fffffff7fffffff;
    auVar84._8_4_ = ABS(fVar116 + fVar55);
    auVar84._12_4_ = ABS(fVar117 + fVar95);
    auVar110._0_8_ = CONCAT44(fVar96,fVar96) & 0x7fffffff7fffffff;
    auVar110._8_4_ = fVar97;
    auVar110._12_4_ = fVar97;
    if (fVar97 <= ABS(fVar131)) {
      auVar110._0_4_ = ABS(fVar131);
    }
  } while (local_c8 <= auVar110._0_4_);
  if ((((local_1ec < 0.0) || (1.0 < local_1ec)) ||
      (auVar110._4_4_ = fStack_1e8, auVar110._0_4_ = fStack_1e8, auVar110._8_4_ = fStack_1e8,
      auVar110._12_4_ = fStack_1e8, fStack_1e8 < 0.0)) || (1.0 < fStack_1e8)) goto LAB_0030d9a5;
  fVar131 = (pre->ray_space).vx.field_0.m128[2];
  fVar55 = (pre->ray_space).vy.field_0.m128[2];
  fVar95 = (pre->ray_space).vz.field_0.m128[2];
  fVar96 = (ray->org).field_0.m128[0];
  fVar97 = (ray->org).field_0.m128[1];
  fVar116 = (ray->org).field_0.m128[2];
  fVar117 = (ray->org).field_0.m128[3];
  auVar91._0_4_ = (local_368 - fVar96) * fVar131;
  auVar91._4_4_ = (fStack_364 - fVar97) * fVar55;
  auVar91._8_4_ = (fStack_360 - fVar116) * fVar95;
  auVar91._12_4_ = (fStack_35c - fVar117) * 0.0;
  auVar92._8_8_ = auVar91._8_8_;
  auVar92._0_8_ = auVar92._8_8_;
  auVar84._4_12_ = auVar92._4_12_;
  fVar139 = 1.0 - fStack_1e8;
  fVar138 = 1.0 - local_1ec;
  fVar118 = fVar138 * fVar138 * fVar138;
  fVar130 = local_1ec * 3.0 * fVar138 * fVar138;
  fVar137 = local_1ec * local_1ec * local_1ec;
  fVar132 = local_1ec * local_1ec * 3.0 * fVar138;
  auVar84._0_4_ =
       ((auVar91._8_4_ + auVar91._4_4_ + auVar91._0_4_) * fVar139 +
       ((fStack_350 - fVar116) * fVar95 +
       (fStack_354 - fVar97) * fVar55 + (local_358 - fVar96) * fVar131) * fStack_1e8) * fVar118 +
       (((fStack_370 - fVar116) * fVar95 +
        (fStack_374 - fVar97) * fVar55 + (local_378 - fVar96) * fVar131) * fVar139 +
       ((fStack_210 - fVar116) * fVar95 +
       (fStack_214 - fVar97) * fVar55 + (local_218 - fVar96) * fVar131) * fStack_1e8) * fVar130 +
       (((fStack_390 - fVar116) * fVar95 +
        (fStack_394 - fVar97) * fVar55 + (local_398 - fVar96) * fVar131) * fVar139 +
       ((fStack_3a0 - fVar116) * fVar95 +
       (fStack_3a4 - fVar97) * fVar55 + (local_3a8 - fVar96) * fVar131) * fStack_1e8) * fVar132 +
       (fVar139 * ((fStack_380 - fVar116) * fVar95 +
                  (fStack_384 - fVar97) * fVar55 + (local_388 - fVar96) * fVar131) +
       ((fStack_3c0 - fVar116) * fVar95 +
       (fStack_3c4 - fVar97) * fVar55 + (local_3c8 - fVar96) * fVar131) * fStack_1e8) * fVar137;
  if (auVar84._0_4_ < fVar117) goto LAB_0030d9a5;
  fVar131 = ray->tfar;
  auVar264 = ZEXT416((uint)fVar131);
  if (fVar131 < auVar84._0_4_) goto LAB_0030d9a5;
  fVar116 = 1.0 - fStack_1e8;
  fVar117 = 1.0 - fStack_1e8;
  fVar139 = 1.0 - fStack_1e8;
  fVar152 = 1.0 - fStack_1e8;
  fVar55 = local_378 * fVar116 + local_218 * fStack_1e8;
  fVar95 = fStack_374 * fVar117 + fStack_214 * fStack_1e8;
  fVar96 = fStack_370 * fVar139 + fStack_210 * fStack_1e8;
  fVar97 = fStack_36c * fVar152 + fStack_20c * fStack_1e8;
  fVar153 = local_398 * fVar116 + local_3a8 * fStack_1e8;
  fVar183 = fStack_394 * fVar117 + fStack_3a4 * fStack_1e8;
  fVar190 = fStack_390 * fVar139 + fStack_3a0 * fStack_1e8;
  fVar154 = fStack_38c * fVar152 + fStack_39c * fStack_1e8;
  fVar191 = fVar153 - fVar55;
  fVar189 = fVar183 - fVar95;
  fVar200 = fVar190 - fVar96;
  fVar181 = fVar154 - fVar97;
  auVar110._4_4_ = local_1ec;
  auVar110._0_4_ = local_1ec;
  auVar110._8_4_ = local_1ec;
  auVar110._12_4_ = local_1ec;
  fVar55 = (((fVar55 - (local_368 * fVar116 + local_358 * fStack_1e8)) * fVar138 +
            local_1ec * fVar191) * fVar138 +
           (fVar191 * fVar138 +
           ((fVar116 * local_388 + fStack_1e8 * local_3c8) - fVar153) * local_1ec) * local_1ec) *
           3.0;
  fVar95 = (((fVar95 - (fStack_364 * fVar117 + fStack_354 * fStack_1e8)) * fVar138 +
            local_1ec * fVar189) * fVar138 +
           (fVar189 * fVar138 +
           ((fVar117 * fStack_384 + fStack_1e8 * fStack_3c4) - fVar183) * local_1ec) * local_1ec) *
           3.0;
  fVar96 = (((fVar96 - (fStack_360 * fVar139 + fStack_350 * fStack_1e8)) * fVar138 +
            local_1ec * fVar200) * fVar138 +
           (fVar200 * fVar138 +
           ((fVar139 * fStack_380 + fStack_1e8 * fStack_3c0) - fVar190) * local_1ec) * local_1ec) *
           3.0;
  fVar97 = (((fVar97 - (fStack_35c * fVar152 + fStack_34c * fStack_1e8)) * fVar138 +
            local_1ec * fVar181) * fVar138 +
           (fVar181 * fVar138 +
           ((fVar152 * fStack_37c + fStack_1e8 * fStack_3bc) - fVar154) * local_1ec) * local_1ec) *
           3.0;
  pGVar5 = (context->scene->geometries).items[local_3d0].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (uVar42 = CONCAT71((int7)((ulong)context->args >> 8),1),
       pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0030e9ac;
    fVar116 = fVar118 * local_198 + fVar130 * local_1a8 + fVar132 * local_1b8 + fVar137 * local_1c8;
    fVar117 = fVar118 * fStack_194 +
              fVar130 * fStack_1a4 + fVar132 * fStack_1b4 + fVar137 * fStack_1c4;
    fVar138 = fVar118 * fStack_190 +
              fVar130 * fStack_1a0 + fVar132 * fStack_1b0 + fVar137 * fStack_1c0;
    fVar118 = fVar118 * fStack_18c +
              fVar130 * fStack_19c + fVar132 * fStack_1ac + fVar137 * fStack_1bc;
    auVar110._0_4_ = fVar117 * fVar55 - fVar95 * fVar116;
    auVar110._4_4_ = fVar138 * fVar95 - fVar96 * fVar117;
    auVar110._8_4_ = fVar116 * fVar96 - fVar55 * fVar138;
    auVar110._12_4_ = fVar118 * fVar97 - fVar97 * fVar118;
    local_1f8 = CONCAT44(auVar110._8_4_,auVar110._4_4_);
    local_1f0 = auVar110._0_4_;
    local_1e4 = (int)_local_298;
    local_1e0 = (int)local_3d0;
    local_1dc = context->user->instID[0];
    local_1d8 = context->user->instPrimID[0];
    ray->tfar = auVar84._0_4_;
    local_3d4 = 0xffffffff;
    local_288.valid = &local_3d4;
    local_288.geometryUserPtr = pGVar5->userPtr;
    local_288.context = context->user;
    local_288.hit = (RTCHitN *)&local_1f8;
    local_288.N = 1;
    local_288.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030e961:
      p_Var43 = context->args->filter;
      if ((p_Var43 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        auVar63 = (*p_Var43)(&local_288);
        auVar110._0_8_ = auVar63._8_8_;
        auVar84._0_8_ = auVar63._0_8_;
        auVar110._8_8_ = extraout_XMM1_Qb_00;
        auVar84._8_8_ = extraout_XMM0_Qb_00;
        p_Var43 = (RTCFilterFunctionN)local_288.valid;
        if (*local_288.valid == 0) goto LAB_0030e99e;
      }
      uVar42 = CONCAT71((int7)((ulong)p_Var43 >> 8),1);
      goto LAB_0030e9ac;
    }
    auVar63 = (*pGVar5->occlusionFilterN)(&local_288);
    auVar110._0_8_ = auVar63._8_8_;
    auVar84._0_8_ = auVar63._0_8_;
    auVar110._8_8_ = extraout_XMM1_Qb;
    auVar84._8_8_ = extraout_XMM0_Qb;
    if (*local_288.valid != 0) goto LAB_0030e961;
LAB_0030e99e:
    auVar84 = ZEXT416((uint)fVar131);
    ray->tfar = fVar131;
  }
  uVar42 = 0;
LAB_0030e9ac:
  bVar45 = bVar45 | (byte)uVar42;
  goto LAB_0030d9a5;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }